

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack4.h
# Opt level: O0

void ncnn::convolution_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  float *slptr;
  int k;
  float *sptr;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  float in_stack_ffffffffffffd760;
  float in_stack_ffffffffffffd764;
  undefined1 in_stack_ffffffffffffd768 [16];
  undefined8 local_2868;
  undefined8 uStack_2860;
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined8 local_2818;
  undefined8 uStack_2810;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  int local_2654;
  undefined8 local_2648;
  undefined8 local_2640;
  undefined8 local_2638;
  undefined4 local_2630;
  long local_2628;
  undefined4 local_2620;
  undefined4 local_261c;
  undefined4 local_2618;
  undefined4 local_2614;
  undefined4 local_2610;
  undefined8 local_2608;
  int local_25fc;
  undefined8 local_25f8;
  undefined8 local_25f0;
  undefined8 local_25e8;
  undefined4 local_25e0;
  long local_25d8;
  undefined4 local_25d0;
  undefined4 local_25cc;
  undefined4 local_25c8;
  undefined4 local_25c4;
  undefined4 local_25c0;
  undefined8 local_25b8;
  undefined8 *local_25b0;
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  int local_2598;
  int local_2594;
  undefined8 local_2590;
  undefined8 local_2588;
  undefined8 local_2580;
  undefined4 local_2578;
  long local_2570;
  undefined4 local_2568;
  undefined4 local_2564;
  undefined4 local_2560;
  undefined4 local_255c;
  undefined4 local_2558;
  undefined8 local_2550;
  long local_2548;
  int local_253c;
  long local_2538;
  int local_252c;
  int local_2528;
  int local_2524;
  int local_2520;
  int local_251c;
  reference local_2518;
  vector<int,_std::allocator<int>_> local_24f8;
  int local_24e0;
  int local_24dc;
  int local_24d8;
  int local_24d4;
  int local_24d0;
  int local_24cc;
  int local_24c8;
  int local_24c4;
  long *local_24c0;
  long *local_24b8;
  long *local_24b0;
  long *local_24a8;
  undefined8 *local_24a0;
  undefined8 *local_2490;
  undefined8 *local_2480;
  undefined8 *local_2458;
  undefined8 *local_2438;
  undefined8 *local_2418;
  undefined1 local_240d;
  int local_240c;
  undefined8 *local_2400;
  undefined8 *local_23e0;
  undefined8 *local_23d8;
  long *local_23d0;
  int local_23c4;
  undefined8 *local_23c0;
  undefined1 local_23b5;
  int local_23b4;
  undefined8 *local_23a8;
  undefined1 local_2385;
  int local_2384;
  undefined8 *local_2378;
  undefined8 *local_2310;
  undefined8 *local_2308;
  undefined8 *local_2300;
  undefined8 *local_22f8;
  undefined8 *local_22f0;
  float local_22e8;
  float fStack_22e4;
  float fStack_22e0;
  float fStack_22dc;
  float local_22d4;
  float *local_22d0;
  float local_22c8;
  float fStack_22c4;
  float fStack_22c0;
  float fStack_22bc;
  float local_22b4;
  float *local_22b0;
  float local_22a8;
  float fStack_22a4;
  float fStack_22a0;
  float fStack_229c;
  float local_2294;
  float *local_2290;
  float local_2288;
  float fStack_2284;
  float fStack_2280;
  float fStack_227c;
  float local_2274;
  float *local_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined1 local_2228 [16];
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  float local_21d8;
  float fStack_21d4;
  float fStack_21d0;
  float fStack_21cc;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  float local_2188;
  float fStack_2184;
  float fStack_2180;
  float fStack_217c;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  float local_2138;
  float fStack_2134;
  float fStack_2130;
  float fStack_212c;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  undefined8 local_2098;
  undefined8 uStack_2090;
  undefined8 local_2088;
  undefined8 uStack_2080;
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined8 local_2068;
  undefined8 uStack_2060;
  undefined8 local_2048;
  undefined8 uStack_2040;
  undefined1 local_2038 [8];
  undefined8 uStack_2030;
  undefined8 local_2028;
  long *local_2020;
  undefined8 local_2018;
  long *local_2010;
  undefined8 local_2008;
  long *local_2000;
  undefined8 local_1ff8;
  long *local_1ff0;
  undefined8 local_1fe8;
  long *local_1fe0;
  undefined1 local_1fd8 [16];
  undefined8 local_1fc8;
  undefined8 uStack_1fc0;
  undefined8 *local_1fb0;
  undefined8 local_1fa8;
  ulong uStack_1fa0;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined1 local_1f68 [16];
  undefined1 local_1f58 [16];
  float local_1f3c;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  float local_1f28;
  float fStack_1f24;
  float fStack_1f20;
  float fStack_1f1c;
  undefined1 local_1f18 [8];
  float fStack_1f10;
  float fStack_1f0c;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined1 local_1ee8 [16];
  undefined1 local_1ed8 [16];
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  float local_1ea8;
  float fStack_1ea4;
  float fStack_1ea0;
  float fStack_1e9c;
  float local_1e8c;
  undefined4 local_1e88;
  undefined4 uStack_1e84;
  undefined4 uStack_1e80;
  undefined4 uStack_1e7c;
  undefined4 local_1e6c;
  undefined4 local_1e68;
  undefined4 uStack_1e64;
  undefined4 uStack_1e60;
  undefined4 uStack_1e5c;
  undefined4 local_1e4c;
  float local_1e48;
  float fStack_1e44;
  float fStack_1e40;
  float fStack_1e3c;
  float local_1e2c;
  float local_1e28;
  float fStack_1e24;
  float fStack_1e20;
  float fStack_1e1c;
  float local_1e0c;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined1 local_1dd8 [16];
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined1 local_1d88 [16];
  undefined4 local_1d78;
  undefined4 uStack_1d74;
  undefined4 uStack_1d70;
  undefined4 uStack_1d6c;
  undefined4 local_1d5c;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined1 local_1d18 [12];
  float fStack_1d0c;
  undefined4 local_1d08;
  undefined4 uStack_1d04;
  undefined4 uStack_1d00;
  undefined4 uStack_1cfc;
  undefined4 local_1cec;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined1 local_1cd8 [8];
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  float local_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined1 local_1c78 [8];
  float fStack_1c70;
  float fStack_1c6c;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined1 local_1c48 [16];
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined4 local_1c18;
  undefined4 uStack_1c14;
  undefined4 uStack_1c10;
  undefined4 uStack_1c0c;
  undefined4 local_1bfc;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  float local_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  undefined1 local_1bc8 [16];
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined1 local_1b98 [16];
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined1 local_1b78 [16];
  undefined1 local_1b68 [8];
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined1 local_1b48 [16];
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined4 local_1b0c;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  float local_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  float fStack_1a1c;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  float local_1988;
  float fStack_1984;
  float fStack_1980;
  float fStack_197c;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined1 local_17b8 [16];
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined1 local_1728 [16];
  undefined1 local_1718 [8];
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined1 local_16f8 [16];
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined4 local_16bc;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  float local_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  float local_1588;
  float fStack_1584;
  float fStack_1580;
  float fStack_157c;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  float local_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  float local_14e8;
  float fStack_14e4;
  float fStack_14e0;
  float fStack_14dc;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  float local_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined1 local_1368 [16];
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  ulong uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined4 local_f88;
  undefined4 uStack_f84;
  undefined4 uStack_f80;
  undefined4 uStack_f7c;
  undefined4 local_f6c;
  undefined4 local_f68;
  undefined4 uStack_f64;
  undefined4 uStack_f60;
  undefined4 uStack_f5c;
  undefined4 local_f4c;
  undefined8 local_f48;
  undefined8 uStack_f40;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined1 local_f08 [16];
  undefined4 local_ef8;
  undefined4 uStack_ef4;
  undefined4 uStack_ef0;
  undefined4 uStack_eec;
  undefined4 local_edc;
  float local_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined1 local_e98 [16];
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined1 local_e78 [16];
  undefined1 local_e68 [8];
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined1 local_e48 [16];
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined4 local_e0c;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  float local_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined1 local_ab8 [16];
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  ulong uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined1 local_8a8 [8];
  undefined8 uStack_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [8];
  undefined8 uStack_860;
  undefined1 local_858 [16];
  undefined8 local_848;
  undefined8 uStack_840;
  undefined1 local_838 [16];
  undefined1 local_828 [8];
  undefined8 uStack_820;
  undefined4 local_80c;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  ulong uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined8 *local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  long local_a0;
  undefined4 local_94;
  long local_90;
  long local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  long local_68;
  undefined4 local_5c;
  long local_58;
  long local_50;
  undefined4 local_44;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_24cc = *(int *)((long)in_RDI + 0x2c);
  local_24d0 = (int)in_RDI[7];
  local_24d4 = *(int *)((long)in_RSI + 0x2c);
  local_24d8 = (int)in_RSI[6];
  local_24dc = (int)in_RSI[7];
  local_24e0 = in_R8D * in_R9D;
  local_24c8 = in_R9D;
  local_24c4 = in_R8D;
  local_24c0 = in_RCX;
  local_24b8 = in_RDX;
  local_24b0 = in_RSI;
  local_24a8 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x83d171);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffd768._8_8_,in_stack_ffffffffffffd768._0_8_,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760));
  std::allocator<int>::~allocator((allocator<int> *)0x83d19d);
  local_2518 = std::vector<int,_std::allocator<int>_>::operator[](&local_24f8,0);
  local_251c = 0;
  local_2520 = 0;
  local_2524 = local_24cc * in_stack_00000010 - local_24c4 * in_stack_00000008;
  for (local_2528 = 0; local_2528 < local_24c8; local_2528 = local_2528 + 1) {
    for (local_252c = 0; local_252c < local_24c4; local_252c = local_252c + 1) {
      local_2518[local_251c] = local_2520;
      local_251c = local_251c + 1;
      local_2520 = in_stack_00000008 + local_2520;
    }
    local_2520 = local_2524 + local_2520;
  }
  local_23d0 = local_24c0;
  local_2538 = *local_24c0;
  for (local_253c = 0; local_253c < local_24dc; local_253c = local_253c + 1) {
    local_2400 = &local_2590;
    local_3c = *(int *)((long)local_24b0 + 0x2c);
    local_40 = (int)local_24b0[6];
    local_44 = *(undefined4 *)((long)local_24b0 + 0x34);
    local_50 = *local_24b0 + local_24b0[8] * (long)local_253c * local_24b0[2];
    local_58 = local_24b0[2];
    local_5c = (undefined4)local_24b0[3];
    local_68 = local_24b0[4];
    local_38 = &local_2590;
    local_28 = (long)local_3c * (long)local_40 * local_58;
    local_23e0 = &local_2590;
    local_24a0 = &local_2590;
    local_2c = 0x10;
    local_240c = local_253c;
    local_240d = 1;
    local_2590 = 0;
    local_2580 = 0;
    local_2578 = 0;
    local_2568 = 0;
    local_2564 = 0;
    local_2560 = 0;
    local_255c = 0;
    local_2558 = 0;
    local_2550 = 0;
    local_2588 = 0;
    local_2548 = local_50;
    for (local_2594 = 0; local_2594 < local_24d8; local_2594 = local_2594 + 1) {
      for (local_2598 = 0; uVar64 = local_1c58, auVar3 = _local_1d18, local_2598 < local_24d4;
          local_2598 = local_2598 + 1) {
        local_25a8 = 0;
        uStack_25a0 = 0;
        if (local_2538 != 0) {
          local_2310 = (undefined8 *)(local_2538 + (long)(local_253c << 2) * 4);
          local_25a8 = *local_2310;
          uStack_25a0 = local_2310[1];
        }
        local_2378 = &local_25f8;
        local_ac = *(int *)((long)local_24b8 + 0x2c);
        local_b0 = (int)local_24b8[6];
        local_b4 = *(undefined4 *)((long)local_24b8 + 0x34);
        local_c0 = (undefined8 *)(*local_24b8 + local_24b8[8] * (long)local_253c * local_24b8[2]);
        local_c8 = local_24b8[2];
        local_cc = (undefined4)local_24b8[3];
        local_d8 = local_24b8[4];
        local_a8 = &local_25f8;
        local_8 = (long)local_ac * (long)local_b0 * local_c8;
        local_23d8 = &local_25f8;
        local_2490 = &local_25f8;
        local_c = 0x10;
        uStack_20a0 = 0;
        local_20a8 = 0;
        local_2384 = local_253c;
        local_2385 = 1;
        local_25f8 = 0;
        local_25e8 = 0;
        local_25e0 = 0;
        local_25d0 = 0;
        local_25cc = 0;
        local_25c8 = 0;
        local_25c4 = 0;
        local_25c0 = 0;
        local_25b8 = 0;
        local_25f0 = 0;
        local_25b0 = local_c0;
        for (local_25fc = 0; local_25fc < local_24d0; local_25fc = local_25fc + 1) {
          local_23a8 = &local_2648;
          local_74 = *(int *)((long)local_24a8 + 0x2c);
          local_78 = (int)local_24a8[6];
          local_7c = *(undefined4 *)((long)local_24a8 + 0x34);
          local_88 = *local_24a8 + local_24a8[8] * (long)local_25fc * local_24a8[2];
          local_90 = local_24a8[2];
          local_94 = (undefined4)local_24a8[3];
          local_a0 = local_24a8[4];
          local_70 = &local_2648;
          local_18 = (long)local_74 * (long)local_78 * local_90;
          local_23c4 = local_2594 * in_stack_00000020;
          local_23c0 = &local_2648;
          for (local_2654 = 0; local_2654 < local_24e0; local_2654 = local_2654 + 1) {
            local_2270 = (float *)(local_88 + (long)local_74 * (long)local_23c4 * local_90 +
                                   (long)(local_2598 * in_stack_00000018 * 4) * 4 +
                                  (long)(local_2518[local_2654] << 2) * 4);
            local_2288 = *local_2270;
            local_2158 = CONCAT44(local_2288,local_2288);
            uStack_2150 = CONCAT44(local_2288,local_2288);
            local_2290 = local_2270 + 1;
            local_22a8 = *local_2290;
            local_21a8 = CONCAT44(local_22a8,local_22a8);
            uStack_21a0 = CONCAT44(local_22a8,local_22a8);
            local_22b0 = local_2270 + 2;
            local_22c8 = *local_22b0;
            local_21f8 = CONCAT44(local_22c8,local_22c8);
            uStack_21f0 = CONCAT44(local_22c8,local_22c8);
            local_22d0 = local_2270 + 3;
            local_22e8 = *local_22d0;
            local_2248 = CONCAT44(local_22e8,local_22e8);
            uStack_2240 = CONCAT44(local_22e8,local_22e8);
            local_22f0 = local_25b0;
            local_2168 = *local_25b0;
            uStack_2160 = local_25b0[1];
            local_22f8 = local_25b0 + 2;
            local_21b8 = *local_22f8;
            uStack_21b0 = local_25b0[3];
            local_2300 = local_25b0 + 4;
            local_2208 = *local_2300;
            uStack_2200 = local_25b0[5];
            local_2308 = local_25b0 + 6;
            local_2258 = *local_2308;
            uStack_2250 = local_25b0[7];
            local_2178 = local_25a8;
            uStack_2170 = uStack_25a0;
            local_2128._0_4_ = (float)local_2168;
            local_2128._4_4_ = (float)((ulong)local_2168 >> 0x20);
            uStack_2120._0_4_ = (float)uStack_2160;
            uStack_2120._4_4_ = (float)((ulong)uStack_2160 >> 0x20);
            local_2138 = local_2288 * (float)local_2128;
            fStack_2134 = local_2288 * local_2128._4_4_;
            fStack_2130 = local_2288 * (float)uStack_2120;
            fStack_212c = local_2288 * uStack_2120._4_4_;
            uVar4 = local_25a8;
            uVar5 = uStack_25a0;
            local_2148._0_4_ = (float)local_25a8;
            local_2148._4_4_ = (float)((ulong)local_25a8 >> 0x20);
            uStack_2140._0_4_ = (float)uStack_25a0;
            uStack_2140._4_4_ = (float)((ulong)uStack_25a0 >> 0x20);
            local_21c8 = CONCAT44(fStack_2134 + local_2148._4_4_,local_2138 + (float)local_2148);
            uStack_21c0 = CONCAT44(fStack_212c + uStack_2140._4_4_,fStack_2130 + (float)uStack_2140)
            ;
            local_2108._0_4_ = (float)local_21b8;
            local_2108._4_4_ = (float)((ulong)local_21b8 >> 0x20);
            uStack_2100._0_4_ = (float)uStack_21b0;
            uStack_2100._4_4_ = (float)((ulong)uStack_21b0 >> 0x20);
            local_2188 = local_22a8 * (float)local_2108;
            fStack_2184 = local_22a8 * local_2108._4_4_;
            fStack_2180 = local_22a8 * (float)uStack_2100;
            fStack_217c = local_22a8 * uStack_2100._4_4_;
            fVar90 = local_2188 + local_2138 + (float)local_2148;
            fVar91 = fStack_2184 + fStack_2134 + local_2148._4_4_;
            fVar92 = fStack_2180 + fStack_2130 + (float)uStack_2140;
            fVar93 = fStack_217c + fStack_212c + uStack_2140._4_4_;
            local_2218 = CONCAT44(fVar91,fVar90);
            uStack_2210 = CONCAT44(fVar93,fVar92);
            local_20e8._0_4_ = (float)local_2208;
            local_20e8._4_4_ = (float)((ulong)local_2208 >> 0x20);
            uStack_20e0._0_4_ = (float)uStack_2200;
            uStack_20e0._4_4_ = (float)((ulong)uStack_2200 >> 0x20);
            local_21d8 = local_22c8 * (float)local_20e8;
            fStack_21d4 = local_22c8 * local_20e8._4_4_;
            fStack_21d0 = local_22c8 * (float)uStack_20e0;
            fStack_21cc = local_22c8 * uStack_20e0._4_4_;
            fVar90 = local_21d8 + fVar90;
            fVar91 = fStack_21d4 + fVar91;
            fVar92 = fStack_21d0 + fVar92;
            fVar93 = fStack_21cc + fVar93;
            local_2268 = CONCAT44(fVar91,fVar90);
            uStack_2260 = CONCAT44(fVar93,fVar92);
            local_20c8._0_4_ = (float)local_2258;
            local_20c8._4_4_ = (float)((ulong)local_2258 >> 0x20);
            uStack_20c0._0_4_ = (float)uStack_2250;
            uStack_20c0._4_4_ = (float)((ulong)uStack_2250 >> 0x20);
            local_2228._0_4_ = local_22e8 * (float)local_20c8;
            local_2228._4_4_ = local_22e8 * local_20c8._4_4_;
            local_2228._8_4_ = local_22e8 * (float)uStack_20c0;
            local_2228._12_4_ = local_22e8 * uStack_20c0._4_4_;
            local_25a8 = CONCAT44(local_2228._4_4_ + fVar91,local_2228._0_4_ + fVar90);
            uStack_25a0 = CONCAT44(local_2228._12_4_ + fVar93,local_2228._8_4_ + fVar92);
            local_25b0 = local_25b0 + 8;
            fStack_22e4 = local_22e8;
            fStack_22e0 = local_22e8;
            fStack_22dc = local_22e8;
            local_22d4 = local_22e8;
            fStack_22c4 = local_22c8;
            fStack_22c0 = local_22c8;
            fStack_22bc = local_22c8;
            local_22b4 = local_22c8;
            fStack_22a4 = local_22a8;
            fStack_22a0 = local_22a8;
            fStack_229c = local_22a8;
            local_2294 = local_22a8;
            fStack_2284 = local_2288;
            fStack_2280 = local_2288;
            fStack_227c = local_2288;
            local_2274 = local_2288;
            local_2238 = local_2268;
            uStack_2230 = uStack_2260;
            local_21e8 = local_2218;
            uStack_21e0 = uStack_2210;
            local_2198 = local_21c8;
            uStack_2190 = uStack_21c0;
            local_2148 = uVar4;
            uStack_2140 = uVar5;
            local_2128 = local_2168;
            uStack_2120 = uStack_2160;
            local_2118 = local_2158;
            uStack_2110 = uStack_2150;
            local_2108 = local_21b8;
            uStack_2100 = uStack_21b0;
            local_20f8 = local_21a8;
            uStack_20f0 = uStack_21a0;
            local_20e8 = local_2208;
            uStack_20e0 = uStack_2200;
            local_20d8 = local_21f8;
            uStack_20d0 = uStack_21f0;
            local_20c8 = local_2258;
            uStack_20c0 = uStack_2250;
            local_20b8 = local_2248;
            uStack_20b0 = uStack_2240;
          }
          local_2480 = &local_2648;
          local_1c = 0x10;
          local_23b4 = local_25fc;
          local_23b5 = 1;
          local_2648 = 0;
          local_2638 = 0;
          local_2630 = 0;
          local_2620 = 0;
          local_261c = 0;
          local_2618 = 0;
          local_2614 = 0;
          local_2610 = 0;
          local_2608 = 0;
          local_2640 = 0;
          local_2458 = local_2480;
          local_2628 = local_a0;
        }
        local_2048 = local_25a8;
        uStack_2040 = uStack_25a0;
        local_1d18._8_4_ = (undefined4)uStack_25a0;
        fStack_1d0c = (float)((ulong)uStack_25a0 >> 0x20);
        local_1c58._0_4_ = (float)local_25a8;
        fVar90 = (float)local_1c58;
        local_1c58._4_4_ = (float)((ulong)local_25a8 >> 0x20);
        fVar91 = local_1c58._4_4_;
        _local_1d18 = auVar3;
        local_1c58 = uVar64;
        switch(in_stack_00000028) {
        case 1:
          local_1fd8._8_8_ = SUB168(ZEXT816(0),4);
          local_1f98 = local_25a8;
          uStack_1f90 = uStack_25a0;
          local_1fa8 = 0;
          uStack_1fa0 = local_1fd8._8_8_;
          auVar6._8_8_ = uStack_25a0;
          auVar6._0_8_ = local_25a8;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = local_1fd8._8_8_;
          _local_2038 = vmaxps_avx(auVar6,auVar60 << 0x40);
          local_1fd8 = ZEXT816(0) << 0x20;
          break;
        case 2:
          local_1fe0 = in_stack_00000030;
          local_1fe8 = 0;
          local_1f3c = *(float *)*in_stack_00000030;
          local_1f38 = local_25a8;
          uStack_1f30 = uStack_25a0;
          local_1ee8._0_12_ = ZEXT812(0);
          local_1ee8._12_4_ = 0;
          local_1eb8 = 0;
          uStack_1eb0 = 0;
          local_1ec8 = local_25a8;
          uStack_1ec0 = uStack_25a0;
          auVar9._8_8_ = uStack_25a0;
          auVar9._0_8_ = local_25a8;
          local_1f58 = vmaxps_avx(ZEXT816(0),auVar9);
          local_1df8 = 0;
          uStack_1df0 = 0;
          local_1e08 = local_25a8;
          uStack_1e00 = uStack_25a0;
          auVar10._8_8_ = uStack_25a0;
          auVar10._0_8_ = local_25a8;
          local_1f68 = vminps_avx(ZEXT816(0),auVar10);
          local_1ef8 = CONCAT44(local_1f3c,local_1f3c);
          uStack_1ef0 = CONCAT44(local_1f3c,local_1f3c);
          local_1f08 = local_1f68._0_8_;
          uVar64 = local_1f08;
          uStack_1f00 = local_1f68._8_8_;
          uVar4 = uStack_1f00;
          local_1f08._0_4_ = local_1f68._0_4_;
          local_1f08._4_4_ = local_1f68._4_4_;
          uStack_1f00._0_4_ = local_1f68._8_4_;
          uStack_1f00._4_4_ = local_1f68._12_4_;
          local_1f28 = local_1f3c * (float)local_1f08;
          fStack_1f24 = local_1f3c * local_1f08._4_4_;
          fStack_1f20 = local_1f3c * (float)uStack_1f00;
          fStack_1f1c = local_1f3c * uStack_1f00._4_4_;
          local_1f18._0_4_ = local_1f58._0_4_;
          local_1f18._4_4_ = local_1f58._4_4_;
          fStack_1f10 = local_1f58._8_4_;
          fStack_1f0c = local_1f58._12_4_;
          local_2038._4_4_ = (float)local_1f18._4_4_ + fStack_1f24;
          local_2038._0_4_ = (float)local_1f18._0_4_ + local_1f28;
          uStack_2030._4_4_ = fStack_1f0c + fStack_1f1c;
          uStack_2030._0_4_ = fStack_1f10 + fStack_1f20;
          _local_1f18 = local_1f58;
          local_1f08 = uVar64;
          uStack_1f00 = uVar4;
          local_1ed8 = local_1ee8;
          local_1ea8 = local_1f3c;
          fStack_1ea4 = local_1f3c;
          fStack_1ea0 = local_1f3c;
          fStack_1e9c = local_1f3c;
          local_1e8c = local_1f3c;
          break;
        case 3:
          local_1ff0 = in_stack_00000030;
          local_1ff8 = 0;
          local_1e68 = *(undefined4 *)*in_stack_00000030;
          local_2068 = CONCAT44(local_1e68,local_1e68);
          uStack_2060 = CONCAT44(local_1e68,local_1e68);
          local_2000 = in_stack_00000030;
          local_2008 = 1;
          local_1e88 = *(undefined4 *)(*in_stack_00000030 + 4);
          local_2078 = CONCAT44(local_1e88,local_1e88);
          uStack_2070 = CONCAT44(local_1e88,local_1e88);
          local_1f78 = local_25a8;
          uStack_1f70 = uStack_25a0;
          auVar8._8_8_ = uStack_25a0;
          auVar8._0_8_ = local_25a8;
          auVar7._8_8_ = uStack_2060;
          auVar7._0_8_ = local_2068;
          local_1dd8 = vmaxps_avx(auVar8,auVar7);
          auVar11._8_8_ = uStack_2070;
          auVar11._0_8_ = local_2078;
          _local_2038 = vminps_avx(local_1dd8,auVar11);
          local_1f88 = local_2068;
          uStack_1f80 = uStack_2060;
          uStack_1e84 = local_1e88;
          uStack_1e80 = local_1e88;
          uStack_1e7c = local_1e88;
          local_1e6c = local_1e88;
          uStack_1e64 = local_1e68;
          uStack_1e60 = local_1e68;
          uStack_1e5c = local_1e68;
          local_1e4c = local_1e68;
          local_1de8 = local_2078;
          uStack_1de0 = uStack_2070;
          break;
        case 4:
          local_1db8 = local_25a8;
          uStack_1db0 = uStack_25a0;
          local_1d5c = 0x3f800000;
          local_1d78 = 0x3f800000;
          uStack_1d74 = 0x3f800000;
          uStack_1d70 = 0x3f800000;
          uStack_1d6c = 0x3f800000;
          local_1dc8 = 0x3f8000003f800000;
          uStack_1dc0 = 0x3f8000003f800000;
          local_1368 = ZEXT816(0) << 0x20;
          local_1d88._8_8_ = SUB168(ZEXT816(0),4);
          local_12c8 = 0;
          uStack_12c0 = local_1d88._8_8_;
          local_12d8 = local_25a8;
          uStack_12d0 = uStack_25a0;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = local_1d88._8_8_;
          auVar22._8_8_ = uStack_25a0;
          auVar22._0_8_ = local_25a8;
          auVar3 = vsubps_avx(auVar61 << 0x40,auVar22);
          local_1738 = 0x3f8000003f800000;
          uStack_1730 = 0x3f8000003f800000;
          local_16f8._0_8_ = auVar3._0_8_;
          local_16f8._8_8_ = auVar3._8_8_;
          local_1328 = local_16f8._0_8_;
          uStack_1320 = local_16f8._8_8_;
          local_1338 = 0x42b0c0a542b0c0a5;
          uStack_1330 = 0x42b0c0a542b0c0a5;
          auVar21._8_8_ = 0x42b0c0a542b0c0a5;
          auVar21._0_8_ = 0x42b0c0a542b0c0a5;
          auVar3 = vminps_avx(auVar3,auVar21);
          local_16f8._0_8_ = auVar3._0_8_;
          local_16f8._8_8_ = auVar3._8_8_;
          local_1348 = local_16f8._0_8_;
          uStack_1340 = local_16f8._8_8_;
          local_1358 = 0xc2b0c0a5c2b0c0a5;
          uStack_1350 = 0xc2b0c0a5c2b0c0a5;
          auVar20._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar2 = vmaxps_avx(auVar3,auVar20);
          local_16f8._0_8_ = auVar2._0_8_;
          local_16f8._8_8_ = auVar2._8_8_;
          local_1378 = local_16f8._0_8_;
          uVar66 = local_1378;
          uStack_1370 = local_16f8._8_8_;
          uVar67 = uStack_1370;
          local_1388 = 0x3fb8aa3b3fb8aa3b;
          uStack_1380 = 0x3fb8aa3b3fb8aa3b;
          local_1378._0_4_ = auVar2._0_4_;
          local_1378._4_4_ = auVar2._4_4_;
          uStack_1370._0_4_ = auVar2._8_4_;
          uStack_1370._4_4_ = auVar2._12_4_;
          local_1718._4_4_ = local_1378._4_4_ * 1.442695;
          local_1718._0_4_ = (float)local_1378 * 1.442695;
          uStack_1710._0_4_ = (float)uStack_1370 * 1.442695;
          uStack_1710._4_4_ = uStack_1370._4_4_ * 1.442695;
          local_1678 = local_1718;
          uStack_1670 = uStack_1710;
          local_1688 = 0x3f0000003f000000;
          uStack_1680 = 0x3f0000003f000000;
          local_1718._0_4_ = (float)local_1378 * 1.442695 + 0.5;
          local_1718._4_4_ = local_1378._4_4_ * 1.442695 + 0.5;
          fVar90 = (float)uStack_1370 * 1.442695 + 0.5;
          fVar91 = uStack_1370._4_4_ * 1.442695 + 0.5;
          uStack_1710._0_4_ = fVar90;
          uStack_1710._4_4_ = fVar91;
          local_12a8 = local_1718;
          uStack_12a0 = uStack_1710;
          local_1728._4_4_ = (int)(float)local_1718._4_4_;
          local_1728._0_4_ = (int)(float)local_1718._0_4_;
          local_1728._8_4_ = (int)fVar90;
          local_1728._12_4_ = (int)fVar91;
          local_1278 = local_1728._0_8_;
          uStack_1270 = local_1728._8_8_;
          auVar23._8_8_ = local_1728._8_8_;
          auVar23._0_8_ = local_1728._0_8_;
          auVar1 = vcvtdq2ps_avx(auVar23);
          local_1708 = auVar1._0_8_;
          uStack_1700 = auVar1._8_8_;
          local_1248 = local_1708;
          uStack_1240 = uStack_1700;
          local_1258 = local_1718;
          uStack_1250 = uStack_1710;
          auVar25._8_8_ = uStack_1710;
          auVar25._0_8_ = local_1718;
          auVar3 = vcmpps_avx(auVar25,auVar1,1);
          local_1748._0_8_ = auVar3._0_8_;
          local_1748._8_8_ = auVar3._8_8_;
          local_1208 = local_1748._0_8_;
          uStack_1200 = local_1748._8_8_;
          local_1218 = 0x3f8000003f800000;
          uStack_1210 = 0x3f8000003f800000;
          auVar27._8_8_ = 0x3f8000003f800000;
          auVar27._0_8_ = 0x3f8000003f800000;
          local_1748 = vpand_avx(auVar3,auVar27);
          local_1308 = local_1708;
          uStack_1300 = uStack_1700;
          local_1318 = local_1748._0_8_;
          uStack_1310 = local_1748._8_8_;
          _local_1718 = vsubps_avx(auVar1,local_1748);
          local_1148 = local_1718;
          uStack_1140 = uStack_1710;
          local_1158 = 0x3f3180003f318000;
          uStack_1150 = 0x3f3180003f318000;
          local_1168 = local_16f8._0_8_;
          uStack_1160 = local_16f8._8_8_;
          local_1128 = local_1718;
          uVar68 = local_1128;
          uStack_1120 = uStack_1710;
          uVar69 = uStack_1120;
          local_1138 = 0x3f3180003f318000;
          uStack_1130 = 0x3f3180003f318000;
          local_1128._0_4_ = local_1718._0_4_;
          local_1128._4_4_ = local_1718._4_4_;
          uStack_1120._0_4_ = local_1718._8_4_;
          uStack_1120._4_4_ = local_1718._12_4_;
          local_1118 = (float)local_1128 * 0.6933594;
          fStack_1114 = local_1128._4_4_ * 0.6933594;
          fStack_1110 = (float)uStack_1120 * 0.6933594;
          fStack_110c = uStack_1120._4_4_ * 0.6933594;
          local_1108 = local_16f8._0_8_;
          uStack_1100 = local_16f8._8_8_;
          auVar30._4_4_ = fStack_1114;
          auVar30._0_4_ = local_1118;
          auVar30._8_4_ = fStack_1110;
          auVar30._12_4_ = fStack_110c;
          auVar3 = vsubps_avx(auVar2,auVar30);
          local_27e8 = auVar3._0_8_;
          uStack_27e0 = auVar3._8_8_;
          local_11b8 = local_1718;
          uStack_11b0 = uStack_1710;
          local_11c8 = 0xb95e8083b95e8083;
          uStack_11c0 = 0xb95e8083b95e8083;
          local_11d8 = local_27e8;
          uStack_11d0 = uStack_27e0;
          local_1198 = local_1718;
          uStack_1190 = uStack_1710;
          local_11a8 = 0xb95e8083b95e8083;
          uStack_11a0 = 0xb95e8083b95e8083;
          local_1188 = (float)local_1128 * -0.00021219444;
          fStack_1184 = local_1128._4_4_ * -0.00021219444;
          fStack_1180 = (float)uStack_1120 * -0.00021219444;
          fStack_117c = uStack_1120._4_4_ * -0.00021219444;
          local_1178 = local_27e8;
          uStack_1170 = uStack_27e0;
          auVar29._4_4_ = fStack_1184;
          auVar29._0_4_ = local_1188;
          auVar29._8_4_ = fStack_1180;
          auVar29._12_4_ = fStack_117c;
          local_16f8 = vsubps_avx(auVar3,auVar29);
          local_2818 = local_16f8._0_8_;
          uStack_2810 = local_16f8._8_8_;
          local_1398 = local_2818;
          uVar5 = local_1398;
          uStack_1390 = uStack_2810;
          uVar65 = uStack_1390;
          local_13a8 = local_2818;
          uStack_13a0 = uStack_2810;
          local_1398._0_4_ = local_16f8._0_4_;
          local_1398._4_4_ = local_16f8._4_4_;
          uStack_1390._0_4_ = local_16f8._8_4_;
          uStack_1390._4_4_ = local_16f8._12_4_;
          local_1708 = CONCAT44(local_1398._4_4_ * local_1398._4_4_,
                                (float)local_1398 * (float)local_1398);
          uStack_1700._0_4_ = (float)uStack_1390 * (float)uStack_1390;
          uStack_1700._4_4_ = uStack_1390._4_4_ * uStack_1390._4_4_;
          local_14b8 = 0x3950696739506967;
          uStack_14b0 = 0x3950696739506967;
          local_14c8 = local_2818;
          uStack_14c0 = uStack_2810;
          local_14d8 = 0x3ab743ce3ab743ce;
          uStack_14d0 = 0x3ab743ce3ab743ce;
          local_1478 = 0x3950696739506967;
          uStack_1470 = 0x3950696739506967;
          local_1488 = local_2818;
          uStack_1480 = uStack_2810;
          local_1498 = (float)local_1398 * 0.00019875691;
          fStack_1494 = local_1398._4_4_ * 0.00019875691;
          fStack_1490 = (float)uStack_1390 * 0.00019875691;
          fStack_148c = uStack_1390._4_4_ * 0.00019875691;
          local_14a8 = 0x3ab743ce3ab743ce;
          uStack_14a0 = 0x3ab743ce3ab743ce;
          local_1758 = CONCAT44(fStack_1494 + 0.0013981999,local_1498 + 0.0013981999);
          uStack_1750 = CONCAT44(fStack_148c + 0.0013981999,fStack_1490 + 0.0013981999);
          local_1508 = local_1758;
          uStack_1500 = uStack_1750;
          local_1518 = local_2818;
          uStack_1510 = uStack_2810;
          local_1528 = 0x3c0889083c088908;
          uStack_1520 = 0x3c0889083c088908;
          local_1458 = local_1758;
          uStack_1450 = uStack_1750;
          local_1468 = local_2818;
          uStack_1460 = uStack_2810;
          local_14e8 = (local_1498 + 0.0013981999) * (float)local_1398;
          fStack_14e4 = (fStack_1494 + 0.0013981999) * local_1398._4_4_;
          fStack_14e0 = (fStack_1490 + 0.0013981999) * (float)uStack_1390;
          fStack_14dc = (fStack_148c + 0.0013981999) * uStack_1390._4_4_;
          local_14f8 = 0x3c0889083c088908;
          uStack_14f0 = 0x3c0889083c088908;
          local_1758 = CONCAT44(fStack_14e4 + 0.008333452,local_14e8 + 0.008333452);
          uStack_1750 = CONCAT44(fStack_14dc + 0.008333452,fStack_14e0 + 0.008333452);
          local_1558 = local_1758;
          uStack_1550 = uStack_1750;
          local_1568 = local_2818;
          uStack_1560 = uStack_2810;
          local_1578 = 0x3d2aa9c13d2aa9c1;
          uStack_1570 = 0x3d2aa9c13d2aa9c1;
          local_1438 = local_1758;
          uStack_1430 = uStack_1750;
          local_1448 = local_2818;
          uStack_1440 = uStack_2810;
          local_1538 = (local_14e8 + 0.008333452) * (float)local_1398;
          fStack_1534 = (fStack_14e4 + 0.008333452) * local_1398._4_4_;
          fStack_1530 = (fStack_14e0 + 0.008333452) * (float)uStack_1390;
          fStack_152c = (fStack_14dc + 0.008333452) * uStack_1390._4_4_;
          local_1548 = 0x3d2aa9c13d2aa9c1;
          uStack_1540 = 0x3d2aa9c13d2aa9c1;
          local_1758 = CONCAT44(fStack_1534 + 0.041665796,local_1538 + 0.041665796);
          uStack_1750 = CONCAT44(fStack_152c + 0.041665796,fStack_1530 + 0.041665796);
          local_15a8 = local_1758;
          uStack_15a0 = uStack_1750;
          local_15b8 = local_2818;
          uStack_15b0 = uStack_2810;
          local_15c8 = 0x3e2aaaaa3e2aaaaa;
          uStack_15c0 = 0x3e2aaaaa3e2aaaaa;
          local_1418 = local_1758;
          uStack_1410 = uStack_1750;
          local_1428 = local_2818;
          uStack_1420 = uStack_2810;
          local_1588 = (local_1538 + 0.041665796) * (float)local_1398;
          fStack_1584 = (fStack_1534 + 0.041665796) * local_1398._4_4_;
          fStack_1580 = (fStack_1530 + 0.041665796) * (float)uStack_1390;
          fStack_157c = (fStack_152c + 0.041665796) * uStack_1390._4_4_;
          local_1598 = 0x3e2aaaaa3e2aaaaa;
          uStack_1590 = 0x3e2aaaaa3e2aaaaa;
          local_1758 = CONCAT44(fStack_1584 + 0.16666666,local_1588 + 0.16666666);
          uStack_1750 = CONCAT44(fStack_157c + 0.16666666,fStack_1580 + 0.16666666);
          local_15f8 = local_1758;
          uStack_15f0 = uStack_1750;
          local_1608 = local_2818;
          uStack_1600 = uStack_2810;
          local_1618 = 0x3f0000003f000000;
          uStack_1610 = 0x3f0000003f000000;
          local_13f8 = local_1758;
          uStack_13f0 = uStack_1750;
          local_1408 = local_2818;
          uStack_1400 = uStack_2810;
          local_15d8 = (local_1588 + 0.16666666) * (float)local_1398;
          fStack_15d4 = (fStack_1584 + 0.16666666) * local_1398._4_4_;
          fStack_15d0 = (fStack_1580 + 0.16666666) * (float)uStack_1390;
          fStack_15cc = (fStack_157c + 0.16666666) * uStack_1390._4_4_;
          local_15e8 = 0x3f0000003f000000;
          uStack_15e0 = 0x3f0000003f000000;
          local_1758 = CONCAT44(fStack_15d4 + 0.5,local_15d8 + 0.5);
          uStack_1750 = CONCAT44(fStack_15cc + 0.5,fStack_15d0 + 0.5);
          local_1648 = local_1758;
          uStack_1640 = uStack_1750;
          local_1658 = local_1708;
          uStack_1650 = uStack_1700;
          local_1668 = local_2818;
          uStack_1660 = uStack_2810;
          local_13d8 = local_1758;
          uStack_13d0 = uStack_1750;
          local_13e8 = local_1708;
          uStack_13e0 = uStack_1700;
          local_1628 = (local_15d8 + 0.5) * (float)local_1398 * (float)local_1398;
          fStack_1624 = (fStack_15d4 + 0.5) * local_1398._4_4_ * local_1398._4_4_;
          fStack_1620 = (fStack_15d0 + 0.5) * (float)uStack_1390 * (float)uStack_1390;
          fStack_161c = (fStack_15cc + 0.5) * uStack_1390._4_4_ * uStack_1390._4_4_;
          local_1638 = local_2818;
          uStack_1630 = uStack_2810;
          local_1758 = CONCAT44(fStack_1624 + local_1398._4_4_,local_1628 + (float)local_1398);
          uStack_1750 = CONCAT44(fStack_161c + uStack_1390._4_4_,fStack_1620 + (float)uStack_1390);
          local_1698 = local_1758;
          uStack_1690 = uStack_1750;
          local_16a8 = 0x3f8000003f800000;
          uStack_16a0 = 0x3f8000003f800000;
          local_1bd8 = local_1628 + (float)local_1398 + 1.0;
          fStack_1bd4 = fStack_1624 + local_1398._4_4_ + 1.0;
          fStack_1bd0 = fStack_1620 + (float)uStack_1390 + 1.0;
          fStack_1bcc = fStack_161c + uStack_1390._4_4_ + 1.0;
          local_1758 = CONCAT44(fStack_1bd4,local_1bd8);
          uStack_1750 = CONCAT44(fStack_1bcc,fStack_1bd0);
          local_12b8 = local_1718;
          uStack_12b0 = uStack_1710;
          local_1728._4_4_ = (int)local_1128._4_4_;
          local_1728._0_4_ = (int)(float)local_1128;
          local_1728._8_4_ = (int)(float)uStack_1120;
          local_1728._12_4_ = (int)uStack_1120._4_4_;
          local_16d8 = local_1728._0_8_;
          uStack_16d0 = local_1728._8_8_;
          local_16e8 = 0x7f0000007f;
          uStack_16e0 = 0x7f0000007f;
          auVar19._8_8_ = local_1728._8_8_;
          auVar19._0_8_ = local_1728._0_8_;
          auVar18._8_8_ = 0x7f0000007f;
          auVar18._0_8_ = 0x7f0000007f;
          auVar3 = vpaddd_avx(auVar19,auVar18);
          local_1728._0_8_ = auVar3._0_8_;
          local_1728._8_8_ = auVar3._8_8_;
          local_16b8 = local_1728._0_8_;
          uStack_16b0 = local_1728._8_8_;
          local_16bc = 0x17;
          local_1728 = vpslld_avx(auVar3,ZEXT416(0x17));
          local_1018 = local_1728._0_8_;
          uStack_1010 = local_1728._8_8_;
          local_1768 = local_1728._0_8_;
          uStack_1760 = local_1728._8_8_;
          local_13b8 = local_1758;
          uStack_13b0 = uStack_1750;
          local_13c8 = local_1728._0_8_;
          uVar64 = local_13c8;
          uStack_13c0 = local_1728._8_8_;
          uVar4 = uStack_13c0;
          local_13c8._0_4_ = local_1728._0_4_;
          local_13c8._4_4_ = local_1728._4_4_;
          uStack_13c0._0_4_ = local_1728._8_4_;
          uStack_13c0._4_4_ = local_1728._12_4_;
          local_1bd8 = local_1bd8 * (float)local_13c8;
          fStack_1bd4 = fStack_1bd4 * local_13c8._4_4_;
          fStack_1bd0 = fStack_1bd0 * (float)uStack_13c0;
          fStack_1bcc = fStack_1bcc * uStack_13c0._4_4_;
          local_1758 = CONCAT44(fStack_1bd4,local_1bd8);
          uStack_1750 = CONCAT44(fStack_1bcc,fStack_1bd0);
          local_1bc8._8_8_ = 0x3f8000003f800000;
          local_1bc8._0_8_ = 0x3f8000003f800000;
          local_1da8 = local_1758;
          uStack_1da0 = uStack_1750;
          local_1bd8 = local_1bd8 + 1.0;
          fStack_1bd4 = fStack_1bd4 + 1.0;
          fStack_1bd0 = fStack_1bd0 + 1.0;
          fStack_1bcc = fStack_1bcc + 1.0;
          auVar12._4_4_ = fStack_1bd4;
          auVar12._0_4_ = local_1bd8;
          auVar12._8_4_ = fStack_1bd0;
          auVar12._12_4_ = fStack_1bcc;
          _local_2038 = vdivps_avx(local_1bc8,auVar12);
          local_1d98 = local_1dc8;
          uStack_1d90 = uStack_1dc0;
          local_1d88 = local_1368;
          local_13c8 = uVar64;
          uStack_13c0 = uVar4;
          local_1398 = uVar5;
          uStack_1390 = uVar65;
          local_1378 = uVar66;
          uStack_1370 = uVar67;
          local_1128 = uVar68;
          uStack_1120 = uVar69;
          break;
        case 5:
          local_1d58 = local_25a8;
          uStack_1d50 = uStack_25a0;
          local_17b8 = ZEXT816(0) << 0x20;
          local_1b88 = 0x3f8000003f800000;
          uStack_1b80 = 0x3f8000003f800000;
          local_1778 = local_25a8;
          uStack_1770 = uStack_25a0;
          local_1788 = 0x42b0c0a542b0c0a5;
          uStack_1780 = 0x42b0c0a542b0c0a5;
          auVar17._8_8_ = uStack_25a0;
          auVar17._0_8_ = local_25a8;
          auVar16._8_8_ = 0x42b0c0a542b0c0a5;
          auVar16._0_8_ = 0x42b0c0a542b0c0a5;
          auVar3 = vminps_avx(auVar17,auVar16);
          local_1b48._0_8_ = auVar3._0_8_;
          local_1b48._8_8_ = auVar3._8_8_;
          local_1798 = local_1b48._0_8_;
          uStack_1790 = local_1b48._8_8_;
          local_17a8 = 0xc2b0c0a5c2b0c0a5;
          uStack_17a0 = 0xc2b0c0a5c2b0c0a5;
          auVar15._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar15._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar2 = vmaxps_avx(auVar3,auVar15);
          local_1b48._0_8_ = auVar2._0_8_;
          local_1b48._8_8_ = auVar2._8_8_;
          local_17c8 = local_1b48._0_8_;
          uVar66 = local_17c8;
          uStack_17c0 = local_1b48._8_8_;
          uVar67 = uStack_17c0;
          local_17d8 = 0x3fb8aa3b3fb8aa3b;
          uStack_17d0 = 0x3fb8aa3b3fb8aa3b;
          local_17c8._0_4_ = auVar2._0_4_;
          local_17c8._4_4_ = auVar2._4_4_;
          uStack_17c0._0_4_ = auVar2._8_4_;
          uStack_17c0._4_4_ = auVar2._12_4_;
          local_1b68._4_4_ = local_17c8._4_4_ * 1.442695;
          local_1b68._0_4_ = (float)local_17c8 * 1.442695;
          uStack_1b60._0_4_ = (float)uStack_17c0 * 1.442695;
          uStack_1b60._4_4_ = uStack_17c0._4_4_ * 1.442695;
          local_1ac8 = local_1b68;
          uStack_1ac0 = uStack_1b60;
          local_1ad8 = 0x3f0000003f000000;
          uStack_1ad0 = 0x3f0000003f000000;
          local_1b68._0_4_ = (float)local_17c8 * 1.442695 + 0.5;
          local_1b68._4_4_ = local_17c8._4_4_ * 1.442695 + 0.5;
          fVar90 = (float)uStack_17c0 * 1.442695 + 0.5;
          fVar91 = uStack_17c0._4_4_ * 1.442695 + 0.5;
          uStack_1b60._0_4_ = fVar90;
          uStack_1b60._4_4_ = fVar91;
          local_1288 = local_1b68;
          uStack_1280 = uStack_1b60;
          local_1b78._4_4_ = (int)(float)local_1b68._4_4_;
          local_1b78._0_4_ = (int)(float)local_1b68._0_4_;
          local_1b78._8_4_ = (int)fVar90;
          local_1b78._12_4_ = (int)fVar91;
          local_1268 = local_1b78._0_8_;
          uStack_1260 = local_1b78._8_8_;
          auVar24._8_8_ = local_1b78._8_8_;
          auVar24._0_8_ = local_1b78._0_8_;
          auVar1 = vcvtdq2ps_avx(auVar24);
          local_1b58 = auVar1._0_8_;
          uStack_1b50 = auVar1._8_8_;
          local_1228 = local_1b58;
          uStack_1220 = uStack_1b50;
          local_1238 = local_1b68;
          uStack_1230 = uStack_1b60;
          auVar26._8_8_ = uStack_1b60;
          auVar26._0_8_ = local_1b68;
          auVar3 = vcmpps_avx(auVar26,auVar1,1);
          local_1b98._0_8_ = auVar3._0_8_;
          local_1b98._8_8_ = auVar3._8_8_;
          local_11e8 = local_1b98._0_8_;
          uStack_11e0 = local_1b98._8_8_;
          local_11f8 = 0x3f8000003f800000;
          uStack_11f0 = 0x3f8000003f800000;
          auVar28._8_8_ = 0x3f8000003f800000;
          auVar28._0_8_ = 0x3f8000003f800000;
          local_1b98 = vpand_avx(auVar3,auVar28);
          local_12e8 = local_1b58;
          uStack_12e0 = uStack_1b50;
          local_12f8 = local_1b98._0_8_;
          uStack_12f0 = local_1b98._8_8_;
          _local_1b68 = vsubps_avx(auVar1,local_1b98);
          local_1068 = local_1b68;
          uStack_1060 = uStack_1b60;
          local_1078 = 0x3f3180003f318000;
          uStack_1070 = 0x3f3180003f318000;
          local_1088 = local_1b48._0_8_;
          uStack_1080 = local_1b48._8_8_;
          local_1048 = local_1b68;
          uVar68 = local_1048;
          uStack_1040 = uStack_1b60;
          uVar69 = uStack_1040;
          local_1058 = 0x3f3180003f318000;
          uStack_1050 = 0x3f3180003f318000;
          local_1048._0_4_ = local_1b68._0_4_;
          local_1048._4_4_ = local_1b68._4_4_;
          uStack_1040._0_4_ = local_1b68._8_4_;
          uStack_1040._4_4_ = local_1b68._12_4_;
          local_1038 = (float)local_1048 * 0.6933594;
          fStack_1034 = local_1048._4_4_ * 0.6933594;
          fStack_1030 = (float)uStack_1040 * 0.6933594;
          fStack_102c = uStack_1040._4_4_ * 0.6933594;
          local_1028 = local_1b48._0_8_;
          uStack_1020 = local_1b48._8_8_;
          auVar32._4_4_ = fStack_1034;
          auVar32._0_4_ = local_1038;
          auVar32._8_4_ = fStack_1030;
          auVar32._12_4_ = fStack_102c;
          auVar3 = vsubps_avx(auVar2,auVar32);
          local_2848 = auVar3._0_8_;
          uStack_2840 = auVar3._8_8_;
          local_10d8 = local_1b68;
          uStack_10d0 = uStack_1b60;
          local_10e8 = 0xb95e8083b95e8083;
          uStack_10e0 = 0xb95e8083b95e8083;
          local_10f8 = local_2848;
          uStack_10f0 = uStack_2840;
          local_10b8 = local_1b68;
          uStack_10b0 = uStack_1b60;
          local_10c8 = 0xb95e8083b95e8083;
          uStack_10c0 = 0xb95e8083b95e8083;
          local_10a8 = (float)local_1048 * -0.00021219444;
          fStack_10a4 = local_1048._4_4_ * -0.00021219444;
          fStack_10a0 = (float)uStack_1040 * -0.00021219444;
          fStack_109c = uStack_1040._4_4_ * -0.00021219444;
          local_1098 = local_2848;
          uStack_1090 = uStack_2840;
          auVar31._4_4_ = fStack_10a4;
          auVar31._0_4_ = local_10a8;
          auVar31._8_4_ = fStack_10a0;
          auVar31._12_4_ = fStack_109c;
          local_1b48 = vsubps_avx(auVar3,auVar31);
          local_2868 = local_1b48._0_8_;
          uStack_2860 = local_1b48._8_8_;
          local_17e8 = local_2868;
          uVar5 = local_17e8;
          uStack_17e0 = uStack_2860;
          uVar65 = uStack_17e0;
          local_17f8 = local_2868;
          uStack_17f0 = uStack_2860;
          local_17e8._0_4_ = local_1b48._0_4_;
          local_17e8._4_4_ = local_1b48._4_4_;
          uStack_17e0._0_4_ = local_1b48._8_4_;
          uStack_17e0._4_4_ = local_1b48._12_4_;
          local_1b58 = CONCAT44(local_17e8._4_4_ * local_17e8._4_4_,
                                (float)local_17e8 * (float)local_17e8);
          uStack_1b50._0_4_ = (float)uStack_17e0 * (float)uStack_17e0;
          uStack_1b50._4_4_ = uStack_17e0._4_4_ * uStack_17e0._4_4_;
          local_1908 = 0x3950696739506967;
          uStack_1900 = 0x3950696739506967;
          local_1918 = local_2868;
          uStack_1910 = uStack_2860;
          local_1928 = 0x3ab743ce3ab743ce;
          uStack_1920 = 0x3ab743ce3ab743ce;
          local_18c8 = 0x3950696739506967;
          uStack_18c0 = 0x3950696739506967;
          local_18d8 = local_2868;
          uStack_18d0 = uStack_2860;
          local_18e8 = (float)local_17e8 * 0.00019875691;
          fStack_18e4 = local_17e8._4_4_ * 0.00019875691;
          fStack_18e0 = (float)uStack_17e0 * 0.00019875691;
          fStack_18dc = uStack_17e0._4_4_ * 0.00019875691;
          local_18f8 = 0x3ab743ce3ab743ce;
          uStack_18f0 = 0x3ab743ce3ab743ce;
          local_1ba8 = CONCAT44(fStack_18e4 + 0.0013981999,local_18e8 + 0.0013981999);
          uStack_1ba0 = CONCAT44(fStack_18dc + 0.0013981999,fStack_18e0 + 0.0013981999);
          local_1958 = local_1ba8;
          uStack_1950 = uStack_1ba0;
          local_1968 = local_2868;
          uStack_1960 = uStack_2860;
          local_1978 = 0x3c0889083c088908;
          uStack_1970 = 0x3c0889083c088908;
          local_18a8 = local_1ba8;
          uStack_18a0 = uStack_1ba0;
          local_18b8 = local_2868;
          uStack_18b0 = uStack_2860;
          local_1938 = (local_18e8 + 0.0013981999) * (float)local_17e8;
          fStack_1934 = (fStack_18e4 + 0.0013981999) * local_17e8._4_4_;
          fStack_1930 = (fStack_18e0 + 0.0013981999) * (float)uStack_17e0;
          fStack_192c = (fStack_18dc + 0.0013981999) * uStack_17e0._4_4_;
          local_1948 = 0x3c0889083c088908;
          uStack_1940 = 0x3c0889083c088908;
          local_1ba8 = CONCAT44(fStack_1934 + 0.008333452,local_1938 + 0.008333452);
          uStack_1ba0 = CONCAT44(fStack_192c + 0.008333452,fStack_1930 + 0.008333452);
          local_19a8 = local_1ba8;
          uStack_19a0 = uStack_1ba0;
          local_19b8 = local_2868;
          uStack_19b0 = uStack_2860;
          local_19c8 = 0x3d2aa9c13d2aa9c1;
          uStack_19c0 = 0x3d2aa9c13d2aa9c1;
          local_1888 = local_1ba8;
          uStack_1880 = uStack_1ba0;
          local_1898 = local_2868;
          uStack_1890 = uStack_2860;
          local_1988 = (local_1938 + 0.008333452) * (float)local_17e8;
          fStack_1984 = (fStack_1934 + 0.008333452) * local_17e8._4_4_;
          fStack_1980 = (fStack_1930 + 0.008333452) * (float)uStack_17e0;
          fStack_197c = (fStack_192c + 0.008333452) * uStack_17e0._4_4_;
          local_1998 = 0x3d2aa9c13d2aa9c1;
          uStack_1990 = 0x3d2aa9c13d2aa9c1;
          local_1ba8 = CONCAT44(fStack_1984 + 0.041665796,local_1988 + 0.041665796);
          uStack_1ba0 = CONCAT44(fStack_197c + 0.041665796,fStack_1980 + 0.041665796);
          local_19f8 = local_1ba8;
          uStack_19f0 = uStack_1ba0;
          local_1a08 = local_2868;
          uStack_1a00 = uStack_2860;
          local_1a18 = 0x3e2aaaaa3e2aaaaa;
          uStack_1a10 = 0x3e2aaaaa3e2aaaaa;
          local_1868 = local_1ba8;
          uStack_1860 = uStack_1ba0;
          local_1878 = local_2868;
          uStack_1870 = uStack_2860;
          local_19d8 = (local_1988 + 0.041665796) * (float)local_17e8;
          fStack_19d4 = (fStack_1984 + 0.041665796) * local_17e8._4_4_;
          fStack_19d0 = (fStack_1980 + 0.041665796) * (float)uStack_17e0;
          fStack_19cc = (fStack_197c + 0.041665796) * uStack_17e0._4_4_;
          local_19e8 = 0x3e2aaaaa3e2aaaaa;
          uStack_19e0 = 0x3e2aaaaa3e2aaaaa;
          local_1ba8 = CONCAT44(fStack_19d4 + 0.16666666,local_19d8 + 0.16666666);
          uStack_1ba0 = CONCAT44(fStack_19cc + 0.16666666,fStack_19d0 + 0.16666666);
          local_1a48 = local_1ba8;
          uStack_1a40 = uStack_1ba0;
          local_1a58 = local_2868;
          uStack_1a50 = uStack_2860;
          local_1a68 = 0x3f0000003f000000;
          uStack_1a60 = 0x3f0000003f000000;
          local_1848 = local_1ba8;
          uStack_1840 = uStack_1ba0;
          local_1858 = local_2868;
          uStack_1850 = uStack_2860;
          local_1a28 = (local_19d8 + 0.16666666) * (float)local_17e8;
          fStack_1a24 = (fStack_19d4 + 0.16666666) * local_17e8._4_4_;
          fStack_1a20 = (fStack_19d0 + 0.16666666) * (float)uStack_17e0;
          fStack_1a1c = (fStack_19cc + 0.16666666) * uStack_17e0._4_4_;
          local_1a38 = 0x3f0000003f000000;
          uStack_1a30 = 0x3f0000003f000000;
          local_1ba8 = CONCAT44(fStack_1a24 + 0.5,local_1a28 + 0.5);
          uStack_1ba0 = CONCAT44(fStack_1a1c + 0.5,fStack_1a20 + 0.5);
          local_1a98 = local_1ba8;
          uStack_1a90 = uStack_1ba0;
          local_1aa8 = local_1b58;
          uStack_1aa0 = uStack_1b50;
          local_1ab8 = local_2868;
          uStack_1ab0 = uStack_2860;
          local_1828 = local_1ba8;
          uStack_1820 = uStack_1ba0;
          local_1838 = local_1b58;
          uStack_1830 = uStack_1b50;
          local_1a78 = (local_1a28 + 0.5) * (float)local_17e8 * (float)local_17e8;
          fStack_1a74 = (fStack_1a24 + 0.5) * local_17e8._4_4_ * local_17e8._4_4_;
          fStack_1a70 = (fStack_1a20 + 0.5) * (float)uStack_17e0 * (float)uStack_17e0;
          fStack_1a6c = (fStack_1a1c + 0.5) * uStack_17e0._4_4_ * uStack_17e0._4_4_;
          local_1a88 = local_2868;
          uStack_1a80 = uStack_2860;
          local_1ba8 = CONCAT44(fStack_1a74 + local_17e8._4_4_,local_1a78 + (float)local_17e8);
          uStack_1ba0 = CONCAT44(fStack_1a6c + uStack_17e0._4_4_,fStack_1a70 + (float)uStack_17e0);
          local_1ae8 = local_1ba8;
          uStack_1ae0 = uStack_1ba0;
          local_1af8 = 0x3f8000003f800000;
          uStack_1af0 = 0x3f8000003f800000;
          fVar90 = local_1a78 + (float)local_17e8 + 1.0;
          fVar91 = fStack_1a74 + local_17e8._4_4_ + 1.0;
          fVar92 = fStack_1a70 + (float)uStack_17e0 + 1.0;
          fVar93 = fStack_1a6c + uStack_17e0._4_4_ + 1.0;
          local_1ba8 = CONCAT44(fVar91,fVar90);
          uStack_1ba0 = CONCAT44(fVar93,fVar92);
          local_1298 = local_1b68;
          uStack_1290 = uStack_1b60;
          local_1b78._4_4_ = (int)local_1048._4_4_;
          local_1b78._0_4_ = (int)(float)local_1048;
          local_1b78._8_4_ = (int)(float)uStack_1040;
          local_1b78._12_4_ = (int)uStack_1040._4_4_;
          local_1b28 = local_1b78._0_8_;
          uStack_1b20 = local_1b78._8_8_;
          local_1b38 = 0x7f0000007f;
          uStack_1b30 = 0x7f0000007f;
          auVar14._8_8_ = local_1b78._8_8_;
          auVar14._0_8_ = local_1b78._0_8_;
          auVar13._8_8_ = 0x7f0000007f;
          auVar13._0_8_ = 0x7f0000007f;
          auVar3 = vpaddd_avx(auVar14,auVar13);
          local_1b78._0_8_ = auVar3._0_8_;
          local_1b78._8_8_ = auVar3._8_8_;
          local_1b08 = local_1b78._0_8_;
          uStack_1b00 = local_1b78._8_8_;
          local_1b0c = 0x17;
          local_1b78 = vpslld_avx(auVar3,ZEXT416(0x17));
          local_1008 = local_1b78._0_8_;
          uStack_1000 = local_1b78._8_8_;
          local_1bb8 = local_1b78._0_8_;
          uStack_1bb0 = local_1b78._8_8_;
          local_1808 = local_1ba8;
          uStack_1800 = uStack_1ba0;
          local_1818 = local_1b78._0_8_;
          uVar64 = local_1818;
          uStack_1810 = local_1b78._8_8_;
          uVar4 = uStack_1810;
          local_1818._0_4_ = local_1b78._0_4_;
          local_1818._4_4_ = local_1b78._4_4_;
          uStack_1810._0_4_ = local_1b78._8_4_;
          uStack_1810._4_4_ = local_1b78._12_4_;
          fVar90 = fVar90 * (float)local_1818;
          fVar91 = fVar91 * local_1818._4_4_;
          fVar92 = fVar92 * (float)uStack_1810;
          fVar93 = fVar93 * uStack_1810._4_4_;
          local_1ba8 = CONCAT44(fVar91,fVar90);
          uStack_1ba0 = CONCAT44(fVar93,fVar92);
          local_1cec = 0x3f800000;
          local_1d08 = 0x3f800000;
          uStack_1d04 = 0x3f800000;
          uStack_1d00 = 0x3f800000;
          uStack_1cfc = 0x3f800000;
          local_1d48 = 0x3f8000003f800000;
          uStack_1d40 = 0x3f8000003f800000;
          local_1d38 = local_1ba8;
          uStack_1d30 = uStack_1ba0;
          local_828._4_4_ = fVar91 + 1.0;
          local_828._0_4_ = fVar90 + 1.0;
          uStack_820._0_4_ = fVar92 + 1.0;
          uStack_820._4_4_ = fVar93 + 1.0;
          local_848 = 0x3f8000003f800000;
          uStack_840 = 0x3f8000003f800000;
          local_2b8._8_8_ = SUB168(ZEXT816(0),4);
          local_158 = local_828;
          uStack_150 = uStack_820;
          local_168 = 0;
          uStack_160 = local_2b8._8_8_;
          auVar56._8_8_ = uStack_820;
          auVar56._0_8_ = local_828;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = local_2b8._8_8_;
          local_858 = vcmpps_avx(auVar56,auVar62 << 0x40,2);
          local_298 = local_828;
          uStack_290 = uStack_820;
          local_2a8 = 0x80000000800000;
          uStack_2a0 = 0x80000000800000;
          auVar49._8_8_ = uStack_820;
          auVar49._0_8_ = local_828;
          auVar48._8_8_ = 0x80000000800000;
          auVar48._0_8_ = 0x80000000800000;
          auVar3 = vmaxps_avx(auVar49,auVar48);
          local_828 = auVar3._0_8_;
          uStack_820 = auVar3._8_8_;
          local_148 = local_828;
          uStack_140 = uStack_820;
          local_808 = local_828;
          uStack_800 = uStack_820;
          local_80c = 0x17;
          auVar2 = vpsrld_avx(auVar3,ZEXT416(0x17));
          local_1e8 = local_828;
          uStack_1e0 = uStack_820;
          local_1f8 = 0x807fffff807fffff;
          uStack_1f0 = 0x807fffff807fffff;
          auVar53._8_8_ = 0x807fffff807fffff;
          auVar53._0_8_ = 0x807fffff807fffff;
          auVar3 = vpand_avx(auVar3,auVar53);
          local_828 = auVar3._0_8_;
          uStack_820 = auVar3._8_8_;
          local_108 = local_828;
          uStack_100 = uStack_820;
          local_118 = 0x3f0000003f000000;
          uStack_110 = 0x3f0000003f000000;
          auVar58._8_8_ = 0x3f0000003f000000;
          auVar58._0_8_ = 0x3f0000003f000000;
          auVar1 = vpor_avx(auVar3,auVar58);
          local_838._0_8_ = auVar2._0_8_;
          local_838._8_8_ = auVar2._8_8_;
          local_7e8 = local_838._0_8_;
          uStack_7e0 = local_838._8_8_;
          local_7f8 = 0x7f0000007f;
          uStack_7f0 = 0x7f0000007f;
          auVar47._8_8_ = 0x7f0000007f;
          auVar47._0_8_ = 0x7f0000007f;
          local_838 = vpsubd_avx(auVar2,auVar47);
          local_248 = local_838._0_8_;
          uStack_240 = local_838._8_8_;
          auVar3 = vcvtdq2ps_avx(local_838);
          local_868 = auVar3._0_8_;
          uStack_860 = auVar3._8_8_;
          local_788 = local_868;
          uVar86 = local_788;
          uStack_780 = uStack_860;
          uVar87 = uStack_780;
          local_798 = 0x3f8000003f800000;
          uStack_790 = 0x3f8000003f800000;
          local_788._0_4_ = auVar3._0_4_;
          local_788._4_4_ = auVar3._4_4_;
          uStack_780._0_4_ = auVar3._8_4_;
          uStack_780._4_4_ = auVar3._12_4_;
          local_868._4_4_ = local_788._4_4_ + 1.0;
          local_868._0_4_ = (float)local_788 + 1.0;
          uStack_860._0_4_ = (float)uStack_780 + 1.0;
          uStack_860._4_4_ = uStack_780._4_4_ + 1.0;
          local_828 = auVar1._0_8_;
          uStack_820 = auVar1._8_8_;
          local_e8 = local_828;
          uStack_e0 = uStack_820;
          local_f8 = 0x3f3504f33f3504f3;
          uStack_f0 = 0x3f3504f33f3504f3;
          auVar59._8_8_ = 0x3f3504f33f3504f3;
          auVar59._0_8_ = 0x3f3504f33f3504f3;
          local_878 = vcmpps_avx(auVar1,auVar59,1);
          local_208 = local_828;
          uStack_200 = uStack_820;
          local_218 = local_878._0_8_;
          uStack_210 = local_878._8_8_;
          local_888 = vpand_avx(auVar1,local_878);
          local_258 = local_828;
          uStack_250 = uStack_820;
          local_268 = 0x3f8000003f800000;
          uStack_260 = 0x3f8000003f800000;
          auVar51._8_8_ = 0x3f8000003f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar3 = vsubps_avx(auVar1,auVar51);
          local_228 = 0x3f8000003f800000;
          uStack_220 = 0x3f8000003f800000;
          local_238 = local_878._0_8_;
          uStack_230 = local_878._8_8_;
          auVar52._8_8_ = 0x3f8000003f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          local_288 = vpand_avx(auVar52,local_878);
          local_278 = local_868;
          uStack_270 = uStack_860;
          auVar50._8_8_ = uStack_860;
          auVar50._0_8_ = local_868;
          _local_868 = vsubps_avx(auVar50,local_288);
          local_828 = auVar3._0_8_;
          uStack_820 = auVar3._8_8_;
          local_7a8 = local_828;
          uVar84 = local_7a8;
          uStack_7a0 = uStack_820;
          uVar85 = uStack_7a0;
          local_7b8 = local_888._0_8_;
          uVar82 = local_7b8;
          uStack_7b0 = local_888._8_8_;
          uVar83 = uStack_7b0;
          local_7a8._0_4_ = auVar3._0_4_;
          local_7a8._4_4_ = auVar3._4_4_;
          uStack_7a0._0_4_ = auVar3._8_4_;
          uStack_7a0._4_4_ = auVar3._12_4_;
          local_7b8._0_4_ = local_888._0_4_;
          local_7b8._4_4_ = local_888._4_4_;
          uStack_7b0._0_4_ = local_888._8_4_;
          uStack_7b0._4_4_ = local_888._12_4_;
          local_7a8._0_4_ = (float)local_7a8 + (float)local_7b8;
          local_7a8._4_4_ = local_7a8._4_4_ + local_7b8._4_4_;
          uStack_7a0._0_4_ = (float)uStack_7a0 + (float)uStack_7b0;
          uStack_7a0._4_4_ = uStack_7a0._4_4_ + uStack_7b0._4_4_;
          local_828._4_4_ = local_7a8._4_4_;
          local_828._0_4_ = (float)local_7a8;
          uStack_820._0_4_ = (float)uStack_7a0;
          uStack_820._4_4_ = uStack_7a0._4_4_;
          local_2c8 = local_828;
          uStack_2c0 = uStack_820;
          local_2d8 = local_828;
          uStack_2d0 = uStack_820;
          local_898 = (float)local_7a8 * (float)local_7a8;
          fStack_894 = local_7a8._4_4_ * local_7a8._4_4_;
          fStack_890 = (float)uStack_7a0 * (float)uStack_7a0;
          fStack_88c = uStack_7a0._4_4_ * uStack_7a0._4_4_;
          local_488 = 0x3d9021bb3d9021bb;
          uStack_480 = 0x3d9021bb3d9021bb;
          local_498 = local_828;
          uStack_490 = uStack_820;
          local_4a8 = 0xbdebd1b8bdebd1b8;
          uStack_4a0 = 0xbdebd1b8bdebd1b8;
          local_448 = 0x3d9021bb3d9021bb;
          uStack_440 = 0x3d9021bb3d9021bb;
          local_458 = local_828;
          uStack_450 = uStack_820;
          local_468 = (float)local_7a8 * 0.070376836;
          fStack_464 = local_7a8._4_4_ * 0.070376836;
          fStack_460 = (float)uStack_7a0 * 0.070376836;
          fStack_45c = uStack_7a0._4_4_ * 0.070376836;
          local_478 = 0xbdebd1b8bdebd1b8;
          uStack_470 = 0xbdebd1b8bdebd1b8;
          local_8a8._4_4_ = fStack_464 + -0.1151461;
          local_8a8._0_4_ = local_468 + -0.1151461;
          uStack_8a0._0_4_ = fStack_460 + -0.1151461;
          uStack_8a0._4_4_ = fStack_45c + -0.1151461;
          local_4d8 = local_8a8;
          uStack_4d0 = uStack_8a0;
          local_4e8 = local_828;
          uStack_4e0 = uStack_820;
          local_4f8 = 0x3def251a3def251a;
          uStack_4f0 = 0x3def251a3def251a;
          local_428 = local_8a8;
          uStack_420 = uStack_8a0;
          local_438 = local_828;
          uStack_430 = uStack_820;
          local_4b8 = (local_468 + -0.1151461) * (float)local_7a8;
          fStack_4b4 = (fStack_464 + -0.1151461) * local_7a8._4_4_;
          fStack_4b0 = (fStack_460 + -0.1151461) * (float)uStack_7a0;
          fStack_4ac = (fStack_45c + -0.1151461) * uStack_7a0._4_4_;
          local_4c8 = 0x3def251a3def251a;
          uStack_4c0 = 0x3def251a3def251a;
          local_8a8._4_4_ = fStack_4b4 + 0.116769984;
          local_8a8._0_4_ = local_4b8 + 0.116769984;
          uStack_8a0._0_4_ = fStack_4b0 + 0.116769984;
          uStack_8a0._4_4_ = fStack_4ac + 0.116769984;
          local_528 = local_8a8;
          uStack_520 = uStack_8a0;
          local_538 = local_828;
          uStack_530 = uStack_820;
          local_548 = 0xbdfe5d4fbdfe5d4f;
          uStack_540 = 0xbdfe5d4fbdfe5d4f;
          local_408 = local_8a8;
          uStack_400 = uStack_8a0;
          local_418 = local_828;
          uStack_410 = uStack_820;
          local_508 = (local_4b8 + 0.116769984) * (float)local_7a8;
          fStack_504 = (fStack_4b4 + 0.116769984) * local_7a8._4_4_;
          fStack_500 = (fStack_4b0 + 0.116769984) * (float)uStack_7a0;
          fStack_4fc = (fStack_4ac + 0.116769984) * uStack_7a0._4_4_;
          local_518 = 0xbdfe5d4fbdfe5d4f;
          uStack_510 = 0xbdfe5d4fbdfe5d4f;
          local_8a8._4_4_ = fStack_504 + -0.12420141;
          local_8a8._0_4_ = local_508 + -0.12420141;
          uStack_8a0._0_4_ = fStack_500 + -0.12420141;
          uStack_8a0._4_4_ = fStack_4fc + -0.12420141;
          local_578 = local_8a8;
          uStack_570 = uStack_8a0;
          local_588 = local_828;
          uStack_580 = uStack_820;
          local_598 = 0x3e11e9bf3e11e9bf;
          uStack_590 = 0x3e11e9bf3e11e9bf;
          local_3e8 = local_8a8;
          uStack_3e0 = uStack_8a0;
          local_3f8 = local_828;
          uStack_3f0 = uStack_820;
          local_558 = (local_508 + -0.12420141) * (float)local_7a8;
          fStack_554 = (fStack_504 + -0.12420141) * local_7a8._4_4_;
          fStack_550 = (fStack_500 + -0.12420141) * (float)uStack_7a0;
          fStack_54c = (fStack_4fc + -0.12420141) * uStack_7a0._4_4_;
          local_568 = 0x3e11e9bf3e11e9bf;
          uStack_560 = 0x3e11e9bf3e11e9bf;
          local_8a8._4_4_ = fStack_554 + 0.14249323;
          local_8a8._0_4_ = local_558 + 0.14249323;
          uStack_8a0._0_4_ = fStack_550 + 0.14249323;
          uStack_8a0._4_4_ = fStack_54c + 0.14249323;
          local_5c8 = local_8a8;
          uStack_5c0 = uStack_8a0;
          local_5d8 = local_828;
          uStack_5d0 = uStack_820;
          local_5e8 = 0xbe2aae50be2aae50;
          uStack_5e0 = 0xbe2aae50be2aae50;
          local_3c8 = local_8a8;
          uStack_3c0 = uStack_8a0;
          local_3d8 = local_828;
          uStack_3d0 = uStack_820;
          local_5a8 = (local_558 + 0.14249323) * (float)local_7a8;
          fStack_5a4 = (fStack_554 + 0.14249323) * local_7a8._4_4_;
          fStack_5a0 = (fStack_550 + 0.14249323) * (float)uStack_7a0;
          fStack_59c = (fStack_54c + 0.14249323) * uStack_7a0._4_4_;
          local_5b8 = 0xbe2aae50be2aae50;
          uStack_5b0 = 0xbe2aae50be2aae50;
          local_8a8._4_4_ = fStack_5a4 + -0.16668057;
          local_8a8._0_4_ = local_5a8 + -0.16668057;
          uStack_8a0._0_4_ = fStack_5a0 + -0.16668057;
          uStack_8a0._4_4_ = fStack_59c + -0.16668057;
          local_618 = local_8a8;
          uStack_610 = uStack_8a0;
          local_628 = local_828;
          uStack_620 = uStack_820;
          local_638 = 0x3e4cceac3e4cceac;
          uStack_630 = 0x3e4cceac3e4cceac;
          local_3a8 = local_8a8;
          uStack_3a0 = uStack_8a0;
          local_3b8 = local_828;
          uStack_3b0 = uStack_820;
          local_5f8 = (local_5a8 + -0.16668057) * (float)local_7a8;
          fStack_5f4 = (fStack_5a4 + -0.16668057) * local_7a8._4_4_;
          fStack_5f0 = (fStack_5a0 + -0.16668057) * (float)uStack_7a0;
          fStack_5ec = (fStack_59c + -0.16668057) * uStack_7a0._4_4_;
          local_608 = 0x3e4cceac3e4cceac;
          uStack_600 = 0x3e4cceac3e4cceac;
          local_8a8._4_4_ = fStack_5f4 + 0.20000714;
          local_8a8._0_4_ = local_5f8 + 0.20000714;
          uStack_8a0._0_4_ = fStack_5f0 + 0.20000714;
          uStack_8a0._4_4_ = fStack_5ec + 0.20000714;
          local_668 = local_8a8;
          uStack_660 = uStack_8a0;
          local_678 = local_828;
          uStack_670 = uStack_820;
          local_688 = 0xbe7ffffcbe7ffffc;
          uStack_680 = 0xbe7ffffcbe7ffffc;
          local_388 = local_8a8;
          uStack_380 = uStack_8a0;
          local_398 = local_828;
          uStack_390 = uStack_820;
          local_648 = (local_5f8 + 0.20000714) * (float)local_7a8;
          fStack_644 = (fStack_5f4 + 0.20000714) * local_7a8._4_4_;
          fStack_640 = (fStack_5f0 + 0.20000714) * (float)uStack_7a0;
          fStack_63c = (fStack_5ec + 0.20000714) * uStack_7a0._4_4_;
          local_658 = 0xbe7ffffcbe7ffffc;
          uStack_650 = 0xbe7ffffcbe7ffffc;
          local_8a8._4_4_ = fStack_644 + -0.24999994;
          local_8a8._0_4_ = local_648 + -0.24999994;
          uStack_8a0._0_4_ = fStack_640 + -0.24999994;
          uStack_8a0._4_4_ = fStack_63c + -0.24999994;
          local_6b8 = local_8a8;
          uStack_6b0 = uStack_8a0;
          local_6c8 = local_828;
          uStack_6c0 = uStack_820;
          local_6d8 = 0x3eaaaaaa3eaaaaaa;
          uStack_6d0 = 0x3eaaaaaa3eaaaaaa;
          local_368 = local_8a8;
          uStack_360 = uStack_8a0;
          local_378 = local_828;
          uStack_370 = uStack_820;
          local_698 = (local_648 + -0.24999994) * (float)local_7a8;
          fStack_694 = (fStack_644 + -0.24999994) * local_7a8._4_4_;
          fStack_690 = (fStack_640 + -0.24999994) * (float)uStack_7a0;
          fStack_68c = (fStack_63c + -0.24999994) * uStack_7a0._4_4_;
          local_6a8 = 0x3eaaaaaa3eaaaaaa;
          uStack_6a0 = 0x3eaaaaaa3eaaaaaa;
          local_8a8._4_4_ = fStack_694 + 0.3333333;
          local_8a8._0_4_ = local_698 + 0.3333333;
          uStack_8a0._0_4_ = fStack_690 + 0.3333333;
          uStack_8a0._4_4_ = fStack_68c + 0.3333333;
          local_2e8 = local_8a8;
          uStack_2e0 = uStack_8a0;
          local_2f8 = local_828;
          uStack_2f0 = uStack_820;
          local_8a8._0_4_ = (local_698 + 0.3333333) * (float)local_7a8;
          local_8a8._4_4_ = (fStack_694 + 0.3333333) * local_7a8._4_4_;
          fVar90 = (fStack_690 + 0.3333333) * (float)uStack_7a0;
          fVar91 = (fStack_68c + 0.3333333) * uStack_7a0._4_4_;
          uStack_8a0._0_4_ = fVar90;
          uStack_8a0._4_4_ = fVar91;
          local_318 = CONCAT44(fStack_894,local_898);
          uStack_310 = CONCAT44(fStack_88c,fStack_890);
          local_308 = local_8a8;
          uStack_300 = uStack_8a0;
          local_8a8._0_4_ = (float)local_8a8._0_4_ * local_898;
          local_8a8._4_4_ = (float)local_8a8._4_4_ * fStack_894;
          fVar90 = fVar90 * fStack_890;
          fVar91 = fVar91 * fStack_88c;
          uStack_8a0._0_4_ = fVar90;
          uStack_8a0._4_4_ = fVar91;
          local_708 = local_868;
          uStack_700 = uStack_860;
          local_718 = 0xb95e8083b95e8083;
          uStack_710 = 0xb95e8083b95e8083;
          local_728 = local_8a8;
          uStack_720 = uStack_8a0;
          local_348 = local_868;
          uVar88 = local_348;
          uStack_340 = uStack_860;
          uVar89 = uStack_340;
          local_358 = 0xb95e8083b95e8083;
          uStack_350 = 0xb95e8083b95e8083;
          local_348._0_4_ = local_868._0_4_;
          local_348._4_4_ = local_868._4_4_;
          uStack_340._0_4_ = local_868._8_4_;
          uStack_340._4_4_ = local_868._12_4_;
          local_6e8 = (float)local_348 * -0.00021219444;
          fStack_6e4 = local_348._4_4_ * -0.00021219444;
          fStack_6e0 = (float)uStack_340 * -0.00021219444;
          fStack_6dc = uStack_340._4_4_ * -0.00021219444;
          local_6f8 = local_8a8;
          uStack_6f0 = uStack_8a0;
          local_8a8._4_4_ = fStack_6e4 + (float)local_8a8._4_4_;
          local_8a8._0_4_ = local_6e8 + (float)local_8a8._0_4_;
          uStack_8a0._0_4_ = fStack_6e0 + fVar90;
          uStack_8a0._4_4_ = fStack_6dc + fVar91;
          local_1b8 = CONCAT44(fStack_894,local_898);
          uStack_1b0 = CONCAT44(fStack_88c,fStack_890);
          local_1c8 = 0x3f0000003f000000;
          uStack_1c0 = 0x3f0000003f000000;
          local_1d8 = local_8a8;
          uStack_1d0 = uStack_8a0;
          local_1a8 = 0x3f0000003f000000;
          uStack_1a0 = 0x3f0000003f000000;
          local_188 = local_898 * 0.5;
          fStack_184 = fStack_894 * 0.5;
          fStack_180 = fStack_890 * 0.5;
          fStack_17c = fStack_88c * 0.5;
          local_178 = local_8a8;
          uStack_170 = uStack_8a0;
          auVar55._8_8_ = uStack_8a0;
          auVar55._0_8_ = local_8a8;
          auVar54._4_4_ = fStack_184;
          auVar54._0_4_ = local_188;
          auVar54._8_4_ = fStack_180;
          auVar54._12_4_ = fStack_17c;
          _local_8a8 = vsubps_avx(auVar55,auVar54);
          local_7c8 = local_828;
          uStack_7c0 = uStack_820;
          local_7d8 = local_8a8;
          uVar80 = local_7d8;
          uStack_7d0 = uStack_8a0;
          uVar81 = uStack_7d0;
          local_7d8._0_4_ = local_8a8._0_4_;
          local_7d8._4_4_ = local_8a8._4_4_;
          uStack_7d0._0_4_ = local_8a8._8_4_;
          uStack_7d0._4_4_ = local_8a8._12_4_;
          local_828._4_4_ = local_7a8._4_4_ + local_7d8._4_4_;
          local_828._0_4_ = (float)local_7a8 + (float)local_7d8;
          uStack_820._0_4_ = (float)uStack_7a0 + (float)uStack_7d0;
          uStack_820._4_4_ = uStack_7a0._4_4_ + uStack_7d0._4_4_;
          local_758 = local_868;
          uStack_750 = uStack_860;
          local_768 = 0x3f3180003f318000;
          uStack_760 = 0x3f3180003f318000;
          local_778 = local_828;
          uStack_770 = uStack_820;
          local_328 = local_868;
          uStack_320 = uStack_860;
          local_338 = 0x3f3180003f318000;
          uStack_330 = 0x3f3180003f318000;
          local_738 = (float)local_348 * 0.6933594;
          fStack_734 = local_348._4_4_ * 0.6933594;
          fStack_730 = (float)uStack_340 * 0.6933594;
          fStack_72c = uStack_340._4_4_ * 0.6933594;
          local_748 = local_828;
          uStack_740 = uStack_820;
          local_828._4_4_ = fStack_734 + local_7a8._4_4_ + local_7d8._4_4_;
          local_828._0_4_ = local_738 + (float)local_7a8 + (float)local_7d8;
          uStack_820._0_4_ = fStack_730 + (float)uStack_7a0 + (float)uStack_7d0;
          uStack_820._4_4_ = fStack_72c + uStack_7a0._4_4_ + uStack_7d0._4_4_;
          local_128 = local_828;
          uStack_120 = uStack_820;
          local_138 = local_858._0_8_;
          uStack_130 = local_858._8_8_;
          auVar57._8_8_ = uStack_820;
          auVar57._0_8_ = local_828;
          _local_828 = vpor_avx(auVar57,local_858);
          local_fd8 = local_828;
          uStack_fd0 = uStack_820;
          local_f4c = 0x3f800000;
          local_f68 = 0x3f800000;
          uStack_f64 = 0x3f800000;
          uStack_f60 = 0x3f800000;
          uStack_f5c = 0x3f800000;
          local_fe8 = 0x3f8000003f800000;
          uStack_fe0 = 0x3f8000003f800000;
          local_f6c = 0x40000000;
          local_f88 = 0x40000000;
          uStack_f84 = 0x40000000;
          uStack_f80 = 0x40000000;
          uStack_f7c = 0x40000000;
          local_ff8 = 0x4000000040000000;
          uStack_ff0 = 0x4000000040000000;
          local_f98 = local_828;
          uVar70 = local_f98;
          uStack_f90 = uStack_820;
          uVar71 = uStack_f90;
          local_f98._0_4_ = local_828._0_4_;
          local_f98._4_4_ = local_828._4_4_;
          uStack_f90._0_4_ = local_828._8_4_;
          uStack_f90._4_4_ = local_828._12_4_;
          local_f38 = (float)local_f98 * 2.0;
          fStack_f34 = local_f98._4_4_ * 2.0;
          fStack_f30 = (float)uStack_f90 * 2.0;
          fStack_f2c = uStack_f90._4_4_ * 2.0;
          local_edc = 0x3f800000;
          local_ef8 = 0x3f800000;
          uStack_ef4 = 0x3f800000;
          uStack_ef0 = 0x3f800000;
          uStack_eec = 0x3f800000;
          local_f48 = 0x3f8000003f800000;
          uStack_f40 = 0x3f8000003f800000;
          local_ab8 = ZEXT816(0) << 0x20;
          local_f08._8_8_ = SUB168(ZEXT816(0),4);
          local_a48 = CONCAT44(fStack_f34,local_f38);
          uStack_a40 = CONCAT44(fStack_f2c,fStack_f30);
          local_a38 = 0;
          uStack_a30 = local_f08._8_8_;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = local_f08._8_8_;
          auVar39._8_8_ = uStack_a40;
          auVar39._0_8_ = local_a48;
          auVar3 = vsubps_avx(auVar63 << 0x40,auVar39);
          local_e88 = 0x3f8000003f800000;
          uStack_e80 = 0x3f8000003f800000;
          local_e48._0_8_ = auVar3._0_8_;
          local_e48._8_8_ = auVar3._8_8_;
          local_a78 = local_e48._0_8_;
          uStack_a70 = local_e48._8_8_;
          local_a88 = 0x42b0c0a542b0c0a5;
          uStack_a80 = 0x42b0c0a542b0c0a5;
          auVar38._8_8_ = 0x42b0c0a542b0c0a5;
          auVar38._0_8_ = 0x42b0c0a542b0c0a5;
          auVar3 = vminps_avx(auVar3,auVar38);
          local_e48._0_8_ = auVar3._0_8_;
          local_e48._8_8_ = auVar3._8_8_;
          local_a98 = local_e48._0_8_;
          uStack_a90 = local_e48._8_8_;
          local_aa8 = 0xc2b0c0a5c2b0c0a5;
          uStack_aa0 = 0xc2b0c0a5c2b0c0a5;
          auVar37._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar37._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar2 = vmaxps_avx(auVar3,auVar37);
          local_e48._0_8_ = auVar2._0_8_;
          local_e48._8_8_ = auVar2._8_8_;
          local_ac8 = local_e48._0_8_;
          uVar76 = local_ac8;
          uStack_ac0 = local_e48._8_8_;
          uVar77 = uStack_ac0;
          local_ad8 = 0x3fb8aa3b3fb8aa3b;
          uStack_ad0 = 0x3fb8aa3b3fb8aa3b;
          local_ac8._0_4_ = auVar2._0_4_;
          local_ac8._4_4_ = auVar2._4_4_;
          uStack_ac0._0_4_ = auVar2._8_4_;
          uStack_ac0._4_4_ = auVar2._12_4_;
          local_e68._4_4_ = local_ac8._4_4_ * 1.442695;
          local_e68._0_4_ = (float)local_ac8 * 1.442695;
          uStack_e60._0_4_ = (float)uStack_ac0 * 1.442695;
          uStack_e60._4_4_ = uStack_ac0._4_4_ * 1.442695;
          local_dc8 = local_e68;
          uStack_dc0 = uStack_e60;
          local_dd8 = 0x3f0000003f000000;
          uStack_dd0 = 0x3f0000003f000000;
          local_e68._0_4_ = (float)local_ac8 * 1.442695 + 0.5;
          local_e68._4_4_ = local_ac8._4_4_ * 1.442695 + 0.5;
          fVar90 = (float)uStack_ac0 * 1.442695 + 0.5;
          fVar91 = uStack_ac0._4_4_ * 1.442695 + 0.5;
          uStack_e60._0_4_ = fVar90;
          uStack_e60._4_4_ = fVar91;
          local_9f8 = local_e68;
          uStack_9f0 = uStack_e60;
          local_e78._4_4_ = (int)(float)local_e68._4_4_;
          local_e78._0_4_ = (int)(float)local_e68._0_4_;
          local_e78._8_4_ = (int)fVar90;
          local_e78._12_4_ = (int)fVar91;
          local_9e8 = local_e78._0_8_;
          uStack_9e0 = local_e78._8_8_;
          auVar42._8_8_ = local_e78._8_8_;
          auVar42._0_8_ = local_e78._0_8_;
          auVar1 = vcvtdq2ps_avx(auVar42);
          local_e58 = auVar1._0_8_;
          uStack_e50 = auVar1._8_8_;
          local_9c8 = local_e58;
          uStack_9c0 = uStack_e50;
          local_9d8 = local_e68;
          uStack_9d0 = uStack_e60;
          auVar43._8_8_ = uStack_e60;
          auVar43._0_8_ = local_e68;
          auVar3 = vcmpps_avx(auVar43,auVar1,1);
          local_e98._0_8_ = auVar3._0_8_;
          local_e98._8_8_ = auVar3._8_8_;
          local_9a8 = local_e98._0_8_;
          uStack_9a0 = local_e98._8_8_;
          local_9b8 = 0x3f8000003f800000;
          uStack_9b0 = 0x3f8000003f800000;
          auVar44._8_8_ = 0x3f8000003f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          local_e98 = vpand_avx(auVar3,auVar44);
          local_a58 = local_e58;
          uStack_a50 = uStack_e50;
          local_a68 = local_e98._0_8_;
          uStack_a60 = local_e98._8_8_;
          _local_e68 = vsubps_avx(auVar1,local_e98);
          local_908 = local_e68;
          uStack_900 = uStack_e60;
          local_918 = 0x3f3180003f318000;
          uStack_910 = 0x3f3180003f318000;
          local_928 = local_e48._0_8_;
          uStack_920 = local_e48._8_8_;
          local_8e8 = local_e68;
          uVar78 = local_8e8;
          uStack_8e0 = uStack_e60;
          uVar79 = uStack_8e0;
          local_8f8 = 0x3f3180003f318000;
          uStack_8f0 = 0x3f3180003f318000;
          local_8e8._0_4_ = local_e68._0_4_;
          local_8e8._4_4_ = local_e68._4_4_;
          uStack_8e0._0_4_ = local_e68._8_4_;
          uStack_8e0._4_4_ = local_e68._12_4_;
          local_8d8 = (float)local_8e8 * 0.6933594;
          fStack_8d4 = local_8e8._4_4_ * 0.6933594;
          fStack_8d0 = (float)uStack_8e0 * 0.6933594;
          fStack_8cc = uStack_8e0._4_4_ * 0.6933594;
          local_8c8 = local_e48._0_8_;
          uStack_8c0 = local_e48._8_8_;
          auVar46._4_4_ = fStack_8d4;
          auVar46._0_4_ = local_8d8;
          auVar46._8_4_ = fStack_8d0;
          auVar46._12_4_ = fStack_8cc;
          auVar3 = vsubps_avx(auVar2,auVar46);
          local_e48._0_8_ = auVar3._0_8_;
          local_e48._8_8_ = auVar3._8_8_;
          local_978 = local_e68;
          uStack_970 = uStack_e60;
          local_988 = 0xb95e8083b95e8083;
          uStack_980 = 0xb95e8083b95e8083;
          local_998 = local_e48._0_8_;
          uStack_990 = local_e48._8_8_;
          local_958 = local_e68;
          uStack_950 = uStack_e60;
          local_968 = 0xb95e8083b95e8083;
          uStack_960 = 0xb95e8083b95e8083;
          local_948 = (float)local_8e8 * -0.00021219444;
          fStack_944 = local_8e8._4_4_ * -0.00021219444;
          fStack_940 = (float)uStack_8e0 * -0.00021219444;
          fStack_93c = uStack_8e0._4_4_ * -0.00021219444;
          local_938 = local_e48._0_8_;
          uStack_930 = local_e48._8_8_;
          auVar45._4_4_ = fStack_944;
          auVar45._0_4_ = local_948;
          auVar45._8_4_ = fStack_940;
          auVar45._12_4_ = fStack_93c;
          local_e48 = vsubps_avx(auVar3,auVar45);
          local_ae8 = local_e48._0_8_;
          uVar74 = local_ae8;
          uStack_ae0 = local_e48._8_8_;
          uVar75 = uStack_ae0;
          local_af8 = local_e48._0_8_;
          uStack_af0 = local_e48._8_8_;
          local_ae8._0_4_ = local_e48._0_4_;
          local_ae8._4_4_ = local_e48._4_4_;
          uStack_ae0._0_4_ = local_e48._8_4_;
          uStack_ae0._4_4_ = local_e48._12_4_;
          local_e58 = CONCAT44(local_ae8._4_4_ * local_ae8._4_4_,(float)local_ae8 * (float)local_ae8
                              );
          uStack_e50._0_4_ = (float)uStack_ae0 * (float)uStack_ae0;
          uStack_e50._4_4_ = uStack_ae0._4_4_ * uStack_ae0._4_4_;
          local_c08 = 0x3950696739506967;
          uStack_c00 = 0x3950696739506967;
          local_c18 = local_e48._0_8_;
          uStack_c10 = local_e48._8_8_;
          local_c28 = 0x3ab743ce3ab743ce;
          uStack_c20 = 0x3ab743ce3ab743ce;
          local_bc8 = 0x3950696739506967;
          uStack_bc0 = 0x3950696739506967;
          local_bd8 = local_e48._0_8_;
          uStack_bd0 = local_e48._8_8_;
          local_be8 = (float)local_ae8 * 0.00019875691;
          fStack_be4 = local_ae8._4_4_ * 0.00019875691;
          fStack_be0 = (float)uStack_ae0 * 0.00019875691;
          fStack_bdc = uStack_ae0._4_4_ * 0.00019875691;
          local_bf8 = 0x3ab743ce3ab743ce;
          uStack_bf0 = 0x3ab743ce3ab743ce;
          local_ea8 = CONCAT44(fStack_be4 + 0.0013981999,local_be8 + 0.0013981999);
          uStack_ea0 = CONCAT44(fStack_bdc + 0.0013981999,fStack_be0 + 0.0013981999);
          local_c58 = local_ea8;
          uStack_c50 = uStack_ea0;
          local_c68 = local_e48._0_8_;
          uStack_c60 = local_e48._8_8_;
          local_c78 = 0x3c0889083c088908;
          uStack_c70 = 0x3c0889083c088908;
          local_ba8 = local_ea8;
          uStack_ba0 = uStack_ea0;
          local_bb8 = local_e48._0_8_;
          uStack_bb0 = local_e48._8_8_;
          local_c38 = (local_be8 + 0.0013981999) * (float)local_ae8;
          fStack_c34 = (fStack_be4 + 0.0013981999) * local_ae8._4_4_;
          fStack_c30 = (fStack_be0 + 0.0013981999) * (float)uStack_ae0;
          fStack_c2c = (fStack_bdc + 0.0013981999) * uStack_ae0._4_4_;
          local_c48 = 0x3c0889083c088908;
          uStack_c40 = 0x3c0889083c088908;
          local_ea8 = CONCAT44(fStack_c34 + 0.008333452,local_c38 + 0.008333452);
          uStack_ea0 = CONCAT44(fStack_c2c + 0.008333452,fStack_c30 + 0.008333452);
          local_ca8 = local_ea8;
          uStack_ca0 = uStack_ea0;
          local_cb8 = local_e48._0_8_;
          uStack_cb0 = local_e48._8_8_;
          local_cc8 = 0x3d2aa9c13d2aa9c1;
          uStack_cc0 = 0x3d2aa9c13d2aa9c1;
          local_b88 = local_ea8;
          uStack_b80 = uStack_ea0;
          local_b98 = local_e48._0_8_;
          uStack_b90 = local_e48._8_8_;
          local_c88 = (local_c38 + 0.008333452) * (float)local_ae8;
          fStack_c84 = (fStack_c34 + 0.008333452) * local_ae8._4_4_;
          fStack_c80 = (fStack_c30 + 0.008333452) * (float)uStack_ae0;
          fStack_c7c = (fStack_c2c + 0.008333452) * uStack_ae0._4_4_;
          local_c98 = 0x3d2aa9c13d2aa9c1;
          uStack_c90 = 0x3d2aa9c13d2aa9c1;
          local_ea8 = CONCAT44(fStack_c84 + 0.041665796,local_c88 + 0.041665796);
          uStack_ea0 = CONCAT44(fStack_c7c + 0.041665796,fStack_c80 + 0.041665796);
          local_cf8 = local_ea8;
          uStack_cf0 = uStack_ea0;
          local_d08 = local_e48._0_8_;
          uStack_d00 = local_e48._8_8_;
          local_d18 = 0x3e2aaaaa3e2aaaaa;
          uStack_d10 = 0x3e2aaaaa3e2aaaaa;
          local_b68 = local_ea8;
          uStack_b60 = uStack_ea0;
          local_b78 = local_e48._0_8_;
          uStack_b70 = local_e48._8_8_;
          local_cd8 = (local_c88 + 0.041665796) * (float)local_ae8;
          fStack_cd4 = (fStack_c84 + 0.041665796) * local_ae8._4_4_;
          fStack_cd0 = (fStack_c80 + 0.041665796) * (float)uStack_ae0;
          fStack_ccc = (fStack_c7c + 0.041665796) * uStack_ae0._4_4_;
          local_ce8 = 0x3e2aaaaa3e2aaaaa;
          uStack_ce0 = 0x3e2aaaaa3e2aaaaa;
          local_ea8 = CONCAT44(fStack_cd4 + 0.16666666,local_cd8 + 0.16666666);
          uStack_ea0 = CONCAT44(fStack_ccc + 0.16666666,fStack_cd0 + 0.16666666);
          local_d48 = local_ea8;
          uStack_d40 = uStack_ea0;
          local_d58 = local_e48._0_8_;
          uStack_d50 = local_e48._8_8_;
          local_d68 = 0x3f0000003f000000;
          uStack_d60 = 0x3f0000003f000000;
          local_b48 = local_ea8;
          uStack_b40 = uStack_ea0;
          local_b58 = local_e48._0_8_;
          uStack_b50 = local_e48._8_8_;
          local_d28 = (local_cd8 + 0.16666666) * (float)local_ae8;
          fStack_d24 = (fStack_cd4 + 0.16666666) * local_ae8._4_4_;
          fStack_d20 = (fStack_cd0 + 0.16666666) * (float)uStack_ae0;
          fStack_d1c = (fStack_ccc + 0.16666666) * uStack_ae0._4_4_;
          local_d38 = 0x3f0000003f000000;
          uStack_d30 = 0x3f0000003f000000;
          local_ea8 = CONCAT44(fStack_d24 + 0.5,local_d28 + 0.5);
          uStack_ea0 = CONCAT44(fStack_d1c + 0.5,fStack_d20 + 0.5);
          local_d98 = local_ea8;
          uStack_d90 = uStack_ea0;
          local_da8 = local_e58;
          uStack_da0 = uStack_e50;
          local_db8 = local_e48._0_8_;
          uStack_db0 = local_e48._8_8_;
          local_b28 = local_ea8;
          uStack_b20 = uStack_ea0;
          local_b38 = local_e58;
          uStack_b30 = uStack_e50;
          local_d78 = (local_d28 + 0.5) * (float)local_ae8 * (float)local_ae8;
          fStack_d74 = (fStack_d24 + 0.5) * local_ae8._4_4_ * local_ae8._4_4_;
          fStack_d70 = (fStack_d20 + 0.5) * (float)uStack_ae0 * (float)uStack_ae0;
          fStack_d6c = (fStack_d1c + 0.5) * uStack_ae0._4_4_ * uStack_ae0._4_4_;
          local_d88 = local_e48._0_8_;
          uStack_d80 = local_e48._8_8_;
          local_ea8 = CONCAT44(fStack_d74 + local_ae8._4_4_,local_d78 + (float)local_ae8);
          uStack_ea0 = CONCAT44(fStack_d6c + uStack_ae0._4_4_,fStack_d70 + (float)uStack_ae0);
          local_de8 = local_ea8;
          uStack_de0 = uStack_ea0;
          local_df8 = 0x3f8000003f800000;
          uStack_df0 = 0x3f8000003f800000;
          local_ed8 = local_d78 + (float)local_ae8 + 1.0;
          fStack_ed4 = fStack_d74 + local_ae8._4_4_ + 1.0;
          fStack_ed0 = fStack_d70 + (float)uStack_ae0 + 1.0;
          fStack_ecc = fStack_d6c + uStack_ae0._4_4_ + 1.0;
          local_ea8 = CONCAT44(fStack_ed4,local_ed8);
          uStack_ea0 = CONCAT44(fStack_ecc,fStack_ed0);
          local_a08 = local_e68;
          uStack_a00 = uStack_e60;
          local_e78._4_4_ = (int)local_8e8._4_4_;
          local_e78._0_4_ = (int)(float)local_8e8;
          local_e78._8_4_ = (int)(float)uStack_8e0;
          local_e78._12_4_ = (int)uStack_8e0._4_4_;
          local_e28 = local_e78._0_8_;
          uStack_e20 = local_e78._8_8_;
          local_e38 = 0x7f0000007f;
          uStack_e30 = 0x7f0000007f;
          auVar36._8_8_ = local_e78._8_8_;
          auVar36._0_8_ = local_e78._0_8_;
          auVar35._8_8_ = 0x7f0000007f;
          auVar35._0_8_ = 0x7f0000007f;
          auVar3 = vpaddd_avx(auVar36,auVar35);
          local_e78._0_8_ = auVar3._0_8_;
          local_e78._8_8_ = auVar3._8_8_;
          local_e08 = local_e78._0_8_;
          uStack_e00 = local_e78._8_8_;
          local_e0c = 0x17;
          local_e78 = vpslld_avx(auVar3,ZEXT416(0x17));
          local_8b8 = local_e78._0_8_;
          uStack_8b0 = local_e78._8_8_;
          local_eb8 = local_e78._0_8_;
          uStack_eb0 = local_e78._8_8_;
          local_b08 = local_ea8;
          uStack_b00 = uStack_ea0;
          local_b18 = local_e78._0_8_;
          uVar72 = local_b18;
          uStack_b10 = local_e78._8_8_;
          uVar73 = uStack_b10;
          local_b18._0_4_ = local_e78._0_4_;
          local_b18._4_4_ = local_e78._4_4_;
          uStack_b10._0_4_ = local_e78._8_4_;
          uStack_b10._4_4_ = local_e78._12_4_;
          local_ed8 = local_ed8 * (float)local_b18;
          fStack_ed4 = fStack_ed4 * local_b18._4_4_;
          fStack_ed0 = fStack_ed0 * (float)uStack_b10;
          fStack_ecc = fStack_ecc * uStack_b10._4_4_;
          local_ea8 = CONCAT44(fStack_ed4,local_ed8);
          uStack_ea0 = CONCAT44(fStack_ecc,fStack_ed0);
          local_f28 = local_ea8;
          uStack_f20 = uStack_ea0;
          local_ed8 = local_ed8 + 1.0;
          fStack_ed4 = fStack_ed4 + 1.0;
          fStack_ed0 = fStack_ed0 + 1.0;
          fStack_ecc = fStack_ecc + 1.0;
          auVar34._8_8_ = 0x3f8000003f800000;
          auVar34._0_8_ = 0x3f8000003f800000;
          auVar33._4_4_ = fStack_ed4;
          auVar33._0_4_ = local_ed8;
          auVar33._8_4_ = fStack_ed0;
          auVar33._12_4_ = fStack_ecc;
          _local_fb8 = vdivps_avx(auVar34,auVar33);
          local_a18 = (float)local_fb8._0_4_ * 2.0;
          fStack_a14 = (float)local_fb8._4_4_ * 2.0;
          fStack_a10 = fStack_fb0 * 2.0;
          fStack_a0c = fStack_fac * 2.0;
          auVar41._4_4_ = fStack_a14;
          auVar41._0_4_ = local_a18;
          auVar41._8_4_ = fStack_a10;
          auVar41._12_4_ = fStack_a0c;
          auVar40._8_8_ = 0x3f8000003f800000;
          auVar40._0_8_ = 0x3f8000003f800000;
          auVar3 = vsubps_avx(auVar41,auVar40);
          auVar2._8_8_ = uStack_25a0;
          auVar2._0_8_ = local_25a8;
          local_1d28._0_4_ = auVar3._0_4_;
          local_1d28._4_4_ = auVar3._4_4_;
          uStack_1d20._0_4_ = auVar3._8_4_;
          uStack_1d20._4_4_ = auVar3._12_4_;
          in_stack_ffffffffffffd760 = (float)local_1d18._8_4_ * (float)uStack_1d20;
          in_stack_ffffffffffffd764 = fStack_1d0c * uStack_1d20._4_4_;
          local_2038._4_4_ = local_1c58._4_4_ * local_1d28._4_4_;
          local_2038._0_4_ = (float)local_1c58 * (float)local_1d28;
          uStack_2030._4_4_ = in_stack_ffffffffffffd764;
          uStack_2030._0_4_ = in_stack_ffffffffffffd760;
          local_1d28 = auVar3._0_8_;
          uStack_1d20 = auVar3._8_8_;
          _local_1d18 = auVar2;
          local_1818 = uVar64;
          uStack_1810 = uVar4;
          local_17e8 = uVar5;
          uStack_17e0 = uVar65;
          local_17c8 = uVar66;
          uStack_17c0 = uVar67;
          local_1048 = uVar68;
          uStack_1040 = uVar69;
          local_fc8 = local_ff8;
          uStack_fc0 = uStack_ff0;
          local_fa8 = local_ff8;
          uStack_fa0 = uStack_ff0;
          local_f98 = uVar70;
          uStack_f90 = uVar71;
          local_f18 = local_f48;
          uStack_f10 = uStack_f40;
          local_f08 = local_ab8;
          local_ec8 = local_f48;
          uStack_ec0 = uStack_f40;
          local_b18 = uVar72;
          uStack_b10 = uVar73;
          local_ae8 = uVar74;
          uStack_ae0 = uVar75;
          local_ac8 = uVar76;
          uStack_ac0 = uVar77;
          local_a28 = local_fe8;
          uStack_a20 = uStack_fe0;
          local_8e8 = uVar78;
          uStack_8e0 = uVar79;
          local_7d8 = uVar80;
          uStack_7d0 = uVar81;
          local_7b8 = uVar82;
          uStack_7b0 = uVar83;
          local_7a8 = uVar84;
          uStack_7a0 = uVar85;
          local_788 = uVar86;
          uStack_780 = uVar87;
          local_348 = uVar88;
          uStack_340 = uVar89;
          local_2b8 = ZEXT816(0) << 0x20;
          local_198 = local_1b8;
          uStack_190 = uStack_1b0;
          break;
        case 6:
          local_2010 = in_stack_00000030;
          local_2018 = 0;
          local_1e28 = *(float *)*in_stack_00000030;
          local_2088 = CONCAT44(local_1e28,local_1e28);
          uStack_2080 = CONCAT44(local_1e28,local_1e28);
          local_2020 = in_stack_00000030;
          local_2028 = 1;
          local_1e48 = *(float *)(*in_stack_00000030 + 4);
          local_2098 = CONCAT44(local_1e48,local_1e48);
          uStack_2090 = CONCAT44(local_1e48,local_1e48);
          local_1cb8 = local_25a8;
          uStack_1cb0 = uStack_25a0;
          local_1bfc = 0x3f800000;
          local_1c18 = 0x3f800000;
          uStack_1c14 = 0x3f800000;
          uStack_1c10 = 0x3f800000;
          uStack_1c0c = 0x3f800000;
          local_1ce8 = 0x3f8000003f800000;
          uStack_1ce0 = 0x3f8000003f800000;
          local_1c58 = local_25a8;
          uStack_1c50 = uStack_25a0;
          local_1c98 = fVar90 * local_1e28;
          fStack_1c94 = fVar91 * local_1e28;
          fStack_1c90 = (float)local_1d18._8_4_ * local_1e28;
          fStack_1c8c = fStack_1d0c * local_1e28;
          local_1cd8._4_4_ = fStack_1c94 + local_1e48;
          local_1cd8._0_4_ = local_1c98 + local_1e48;
          uStack_1cd0._0_4_ = fStack_1c90 + local_1e48;
          uStack_1cd0._4_4_ = fStack_1c8c + local_1e48;
          local_1c48 = ZEXT416(0) << 0x20;
          local_1c28 = local_1cd8;
          uStack_1c20 = uStack_1cd0;
          local_1c38 = 0;
          uStack_1c30 = 0;
          auVar3._8_8_ = uStack_1cd0;
          auVar3._0_8_ = local_1cd8;
          auVar3 = vmaxps_avx(auVar3,ZEXT816(0));
          local_1cd8 = auVar3._0_8_;
          uStack_1cd0 = auVar3._8_8_;
          local_1be8 = local_1cd8;
          uStack_1be0 = uStack_1cd0;
          auVar1._8_8_ = 0x3f8000003f800000;
          auVar1._0_8_ = 0x3f8000003f800000;
          _local_1cd8 = vminps_avx(auVar3,auVar1);
          local_1c88 = local_25a8;
          uStack_1c80 = uStack_25a0;
          local_1c78._0_4_ = local_1cd8._0_4_;
          local_1c78._4_4_ = local_1cd8._4_4_;
          fStack_1c70 = local_1cd8._8_4_;
          fStack_1c6c = local_1cd8._12_4_;
          local_2038._4_4_ = (float)local_1c78._4_4_ * fVar91;
          local_2038._0_4_ = (float)local_1c78._0_4_ * fVar90;
          uStack_2030._0_4_ = fStack_1c70 * (float)local_1d18._8_4_;
          uStack_2030._4_4_ = fStack_1c6c * fStack_1d0c;
          fStack_1e44 = local_1e48;
          fStack_1e40 = local_1e48;
          fStack_1e3c = local_1e48;
          local_1e2c = local_1e48;
          fStack_1e24 = local_1e28;
          fStack_1e20 = local_1e28;
          fStack_1e1c = local_1e28;
          local_1e0c = local_1e28;
          local_1cc8 = local_2088;
          uStack_1cc0 = uStack_2080;
          local_1ca8 = local_2098;
          uStack_1ca0 = uStack_2090;
          _local_1c78 = _local_1cd8;
          local_1c68 = local_2088;
          uStack_1c60 = uStack_2080;
          local_1bf8 = local_1ce8;
          uStack_1bf0 = uStack_1ce0;
          break;
        default:
          uStack_2030 = uStack_25a0;
          local_2038 = (undefined1  [8])local_25a8;
        }
        local_25a8 = local_2038;
        uStack_25a0 = uStack_2030;
        local_1fb0 = (undefined8 *)(local_2548 + (long)(local_2598 << 2) * 4);
        local_1fc8 = local_2038;
        uStack_1fc0 = uStack_2030;
        *local_1fb0 = local_2038;
        local_1fb0[1] = uStack_2030;
        local_2438 = local_2490;
        local_25d8 = local_d8;
      }
      local_2548 = local_2548 + (long)(local_24d4 << 2) * 4;
    }
    local_2418 = local_24a0;
    local_2570 = local_68;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760));
  return;
}

Assistant:

static void convolution_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                    for (int k = 0; k < maxk; k++)
                    {
                        const float* slptr = sptr + space_ofs[k] * 4;

                        __m128 _val0 = _mm_load1_ps(slptr);
                        __m128 _val1 = _mm_load1_ps(slptr + 1);
                        __m128 _val2 = _mm_load1_ps(slptr + 2);
                        __m128 _val3 = _mm_load1_ps(slptr + 3);

                        __m128 _w0 = _mm_load_ps(kptr);
                        __m128 _w1 = _mm_load_ps(kptr + 4);
                        __m128 _w2 = _mm_load_ps(kptr + 8);
                        __m128 _w3 = _mm_load_ps(kptr + 12);

                        _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                        _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                        _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                        _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);

                        kptr += 16;
                    }
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr + j * 4, _sum);
            }

            outptr += outw * 4;
        }
    }
}